

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bash_f64.c
# Opt level: O2

void bashF0(u64 *s)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  ulong uVar19;
  ulong uVar20;
  ulong uVar21;
  ulong uVar22;
  ulong uVar23;
  ulong uVar24;
  ulong uVar25;
  ulong uVar26;
  ulong uVar27;
  ulong uVar28;
  ulong uVar29;
  ulong uVar30;
  ulong uVar31;
  ulong uVar32;
  ulong uVar33;
  
  uVar6 = *s;
  uVar24 = s[0x10];
  uVar5 = s[8] ^ uVar6 ^ uVar24;
  uVar17 = (uVar5 << 0x35 | uVar5 >> 0xb) ^ s[8];
  uVar1 = (uVar6 << 8 | uVar6 >> 0x38) ^ uVar17;
  uVar6 = s[1];
  uVar24 = (uVar24 << 0xe | uVar24 >> 0x32) ^ uVar24 ^ (uVar17 << 1 | (ulong)((long)uVar17 < 0));
  uVar18 = uVar1 & uVar5 ^ uVar24;
  uVar14 = (~uVar24 | uVar1) ^ uVar5;
  uVar1 = (uVar24 | uVar5) ^ uVar1;
  uVar24 = s[0x11];
  uVar13 = s[9] ^ uVar6 ^ uVar24;
  uVar17 = (uVar13 << 0x33 | uVar13 >> 0xd) ^ s[9];
  uVar5 = (uVar6 << 0x38 | uVar6 >> 8) ^ uVar17;
  uVar28 = (uVar24 << 0x22 | uVar24 >> 0x1e) ^ uVar24 ^ (uVar17 << 7 | uVar17 >> 0x39);
  uVar2 = uVar5 & uVar13 ^ uVar28;
  uVar29 = (uVar28 | uVar13) ^ uVar5;
  uVar6 = s[2];
  uVar24 = s[0x12];
  uVar3 = s[10] ^ uVar6 ^ uVar24;
  uVar19 = (uVar3 << 0x25 | uVar3 >> 0x1b) ^ s[10];
  uVar17 = (uVar6 << 8 | uVar6 >> 0x38) ^ uVar19;
  uVar6 = (uVar24 << 0x2e | uVar24 >> 0x12) ^ uVar24 ^ (uVar19 << 0x31 | uVar19 >> 0xf);
  uVar20 = uVar17 & uVar3 ^ uVar6;
  uVar15 = (~uVar6 | uVar17) ^ uVar3;
  uVar17 = (uVar6 | uVar3) ^ uVar17;
  uVar6 = s[3];
  uVar24 = s[0x13];
  uVar19 = s[0xb] ^ uVar6 ^ uVar24;
  uVar21 = (uVar19 << 3 | uVar19 >> 0x3d) ^ s[0xb];
  uVar3 = (uVar6 << 0x38 | uVar6 >> 8) ^ uVar21;
  uVar6 = (uVar24 << 2 | uVar24 >> 0x3e) ^ uVar24 ^ (uVar21 << 0x17 | uVar21 >> 0x29);
  uVar7 = uVar3 & uVar19 ^ uVar6;
  uVar27 = (~uVar6 | uVar3) ^ uVar19;
  uVar3 = (uVar6 | uVar19) ^ uVar3;
  uVar6 = s[4];
  uVar24 = s[0x14];
  uVar21 = s[0xc] ^ uVar6 ^ uVar24;
  uVar22 = (uVar21 << 0x15 | uVar21 >> 0x2b) ^ s[0xc];
  uVar19 = (uVar6 << 8 | uVar6 >> 0x38) ^ uVar22;
  uVar6 = (uVar24 << 0xe | uVar24 >> 0x32) ^ uVar24 ^ (uVar22 << 0x21 | uVar22 >> 0x1f);
  uVar8 = uVar19 & uVar21 ^ uVar6;
  uVar9 = (~uVar6 | uVar19) ^ uVar21;
  uVar19 = (uVar6 | uVar21) ^ uVar19;
  uVar6 = s[5];
  uVar24 = s[0x15];
  uVar22 = s[0xd] ^ uVar6 ^ uVar24;
  uVar23 = (uVar22 << 0x13 | uVar22 >> 0x2d) ^ s[0xd];
  uVar21 = (uVar6 << 0x38 | uVar6 >> 8) ^ uVar23;
  uVar6 = (uVar24 << 0x22 | uVar24 >> 0x1e) ^ uVar24 ^ (uVar23 << 0x27 | uVar23 >> 0x19);
  uVar10 = uVar21 & uVar22 ^ uVar6;
  uVar11 = (~uVar6 | uVar21) ^ uVar22;
  uVar21 = (uVar6 | uVar22) ^ uVar21;
  uVar6 = s[6];
  uVar24 = s[0x16];
  uVar23 = s[0xe] ^ uVar6 ^ uVar24;
  uVar25 = (uVar23 << 5 | uVar23 >> 0x3b) ^ s[0xe];
  uVar22 = (uVar6 << 8 | uVar6 >> 0x38) ^ uVar25;
  uVar6 = (uVar24 << 0x2e | uVar24 >> 0x12) ^ uVar24 ^ (uVar25 << 0x11 | uVar25 >> 0x2f);
  uVar16 = uVar22 & uVar23 ^ uVar6;
  uVar26 = (~uVar6 | uVar22) ^ uVar23;
  uVar22 = (uVar6 | uVar23) ^ uVar22;
  uVar6 = s[7];
  uVar24 = s[0x17];
  uVar12 = s[0xf] ^ uVar6 ^ uVar24;
  uVar25 = (uVar12 << 0x23 | uVar12 >> 0x1d) ^ s[0xf];
  uVar23 = (uVar6 << 0x38 | uVar6 >> 8) ^ uVar25;
  uVar6 = (uVar24 << 2 | uVar24 >> 0x3e) ^ uVar24 ^ (uVar25 << 0x37 | uVar25 >> 9);
  uVar4 = uVar23 & uVar12 ^ uVar6;
  uVar31 = (~uVar6 | uVar23) ^ uVar12;
  uVar23 = (uVar6 | uVar12) ^ uVar23;
  uVar33 = uVar13 ^ 0x3bf5080ac8ba94b1 ^ (~uVar28 | uVar5);
  uVar24 = uVar2 ^ uVar23 ^ uVar26;
  uVar2 = (uVar24 << 0x35 | uVar24 >> 0xb) ^ uVar2;
  uVar6 = (uVar23 << 8 | uVar23 >> 0x38) ^ uVar2;
  uVar5 = (uVar26 << 0xe | uVar26 >> 0x32) ^ uVar26 ^ (uVar2 << 1 | (ulong)((long)uVar2 < 0));
  uVar12 = uVar6 & uVar24 ^ uVar5;
  uVar13 = (~uVar5 | uVar6) ^ uVar24;
  uVar26 = uVar17 ^ uVar18 ^ uVar27;
  uVar6 = (uVar5 | uVar24) ^ uVar6;
  uVar18 = (uVar26 << 0x33 | uVar26 >> 0xd) ^ uVar18;
  uVar23 = (uVar17 << 0x38 | uVar17 >> 8) ^ uVar18;
  uVar27 = (uVar27 << 0x22 | uVar27 >> 0x1e) ^ uVar27 ^ (uVar18 << 7 | uVar18 >> 0x39);
  uVar24 = uVar23 & uVar26 ^ uVar27;
  uVar28 = (uVar27 | uVar26) ^ uVar23;
  uVar18 = uVar29 ^ uVar7 ^ uVar14;
  uVar7 = (uVar18 << 0x25 | uVar18 >> 0x1b) ^ uVar7;
  uVar5 = (uVar29 << 8 | uVar29 >> 0x38) ^ uVar7;
  uVar17 = (uVar14 << 0x2e | uVar14 >> 0x12) ^ uVar14 ^ (uVar7 << 0x31 | uVar7 >> 0xf);
  uVar2 = uVar5 & uVar18 ^ uVar17;
  uVar25 = (~uVar17 | uVar5) ^ uVar18;
  uVar5 = (uVar17 | uVar18) ^ uVar5;
  uVar18 = uVar19 ^ uVar20 ^ uVar11;
  uVar20 = (uVar18 << 3 | uVar18 >> 0x3d) ^ uVar20;
  uVar17 = (uVar19 << 0x38 | uVar19 >> 8) ^ uVar20;
  uVar19 = (uVar11 << 2 | uVar11 >> 0x3e) ^ uVar11 ^ (uVar20 << 0x17 | uVar20 >> 0x29);
  uVar7 = uVar17 & uVar18 ^ uVar19;
  uVar29 = (~uVar19 | uVar17) ^ uVar18;
  uVar11 = uVar3 ^ uVar10 ^ uVar15;
  uVar17 = (uVar19 | uVar18) ^ uVar17;
  uVar10 = (uVar11 << 0x15 | uVar11 >> 0x2b) ^ uVar10;
  uVar14 = (uVar3 << 8 | uVar3 >> 0x38) ^ uVar10;
  uVar19 = (uVar15 << 0xe | uVar15 >> 0x32) ^ uVar15 ^ (uVar10 << 0x21 | uVar10 >> 0x1f);
  uVar3 = uVar14 & uVar11 ^ uVar19;
  uVar20 = (~uVar19 | uVar14) ^ uVar11;
  uVar14 = (uVar19 | uVar11) ^ uVar14;
  uVar11 = uVar22 ^ uVar8 ^ uVar31;
  uVar8 = (uVar11 << 0x13 | uVar11 >> 0x2d) ^ uVar8;
  uVar10 = (uVar22 << 0x38 | uVar22 >> 8) ^ uVar8;
  uVar19 = (uVar31 << 0x22 | uVar31 >> 0x1e) ^ uVar31 ^ (uVar8 << 0x27 | uVar8 >> 0x19);
  uVar18 = uVar10 & uVar11 ^ uVar19;
  uVar15 = (~uVar19 | uVar10) ^ uVar11;
  uVar10 = (uVar19 | uVar11) ^ uVar10;
  uVar22 = uVar21 ^ uVar4 ^ uVar9;
  uVar4 = (uVar22 << 5 | uVar22 >> 0x3b) ^ uVar4;
  uVar11 = (uVar21 << 8 | uVar21 >> 0x38) ^ uVar4;
  uVar19 = (uVar9 << 0x2e | uVar9 >> 0x12) ^ uVar9 ^ (uVar4 << 0x11 | uVar4 >> 0x2f);
  uVar4 = uVar11 & uVar22 ^ uVar19;
  uVar8 = (~uVar19 | uVar11) ^ uVar22;
  uVar11 = (uVar19 | uVar22) ^ uVar11;
  uVar21 = uVar1 ^ uVar16 ^ uVar33;
  uVar16 = (uVar21 << 0x23 | uVar21 >> 0x1d) ^ uVar16;
  uVar19 = (uVar1 << 0x38 | uVar1 >> 8) ^ uVar16;
  uVar22 = (uVar33 << 2 | uVar33 >> 0x3e) ^ uVar33 ^ (uVar16 << 0x37 | uVar16 >> 9);
  uVar9 = uVar19 & uVar21 ^ uVar22;
  uVar1 = (~uVar22 | uVar19) ^ uVar21;
  uVar19 = (uVar22 | uVar21) ^ uVar19;
  uVar26 = uVar26 ^ 0xc1d1659c1bbd92f6 ^ (~uVar27 | uVar23);
  uVar21 = uVar19 ^ uVar24 ^ uVar8;
  uVar24 = (uVar21 << 0x35 | uVar21 >> 0xb) ^ uVar24;
  uVar16 = (uVar19 << 8 | uVar19 >> 0x38) ^ uVar24;
  uVar24 = (uVar8 << 0xe | uVar8 >> 0x32) ^ uVar8 ^ (uVar24 << 1 | (ulong)((long)uVar24 < 0));
  uVar19 = uVar16 & uVar21 ^ uVar24;
  uVar27 = (~uVar24 | uVar16) ^ uVar21;
  uVar16 = (uVar24 | uVar21) ^ uVar16;
  uVar8 = uVar5 ^ uVar12 ^ uVar29;
  uVar12 = (uVar8 << 0x33 | uVar8 >> 0xd) ^ uVar12;
  uVar31 = (uVar5 << 0x38 | uVar5 >> 8) ^ uVar12;
  uVar29 = (uVar29 << 0x22 | uVar29 >> 0x1e) ^ uVar29 ^ (uVar12 << 7 | uVar12 >> 0x39);
  uVar24 = uVar31 & uVar8 ^ uVar29;
  uVar5 = uVar7 ^ uVar28 ^ uVar13;
  uVar33 = (uVar29 | uVar8) ^ uVar31;
  uVar7 = (uVar5 << 0x25 | uVar5 >> 0x1b) ^ uVar7;
  uVar12 = (uVar28 << 8 | uVar28 >> 0x38) ^ uVar7;
  uVar21 = (uVar13 << 0x2e | uVar13 >> 0x12) ^ uVar13 ^ (uVar7 << 0x31 | uVar7 >> 0xf);
  uVar22 = uVar12 & uVar5 ^ uVar21;
  uVar28 = (~uVar21 | uVar12) ^ uVar5;
  uVar12 = (uVar21 | uVar5) ^ uVar12;
  uVar5 = uVar14 ^ uVar2 ^ uVar15;
  uVar2 = (uVar5 << 3 | uVar5 >> 0x3d) ^ uVar2;
  uVar7 = (uVar14 << 0x38 | uVar14 >> 8) ^ uVar2;
  uVar23 = (uVar15 << 2 | uVar15 >> 0x3e) ^ uVar15 ^ (uVar2 << 0x17 | uVar2 >> 0x29);
  uVar21 = uVar7 & uVar5 ^ uVar23;
  uVar13 = (~uVar23 | uVar7) ^ uVar5;
  uVar7 = (uVar23 | uVar5) ^ uVar7;
  uVar23 = uVar17 ^ uVar18 ^ uVar25;
  uVar18 = (uVar23 << 0x15 | uVar23 >> 0x2b) ^ uVar18;
  uVar5 = (uVar17 << 8 | uVar17 >> 0x38) ^ uVar18;
  uVar17 = (uVar25 << 0xe | uVar25 >> 0x32) ^ uVar25 ^ (uVar18 << 0x21 | uVar18 >> 0x1f);
  uVar14 = uVar5 & uVar23 ^ uVar17;
  uVar15 = (~uVar17 | uVar5) ^ uVar23;
  uVar5 = (uVar17 | uVar23) ^ uVar5;
  uVar17 = uVar3 ^ uVar11 ^ uVar1;
  uVar3 = (uVar17 << 0x13 | uVar17 >> 0x2d) ^ uVar3;
  uVar11 = (uVar11 << 0x38 | uVar11 >> 8) ^ uVar3;
  uVar3 = (uVar1 << 0x22 | uVar1 >> 0x1e) ^ uVar1 ^ (uVar3 << 0x27 | uVar3 >> 0x19);
  uVar23 = uVar11 & uVar17 ^ uVar3;
  uVar32 = (~uVar3 | uVar11) ^ uVar17;
  uVar2 = uVar9 ^ uVar10 ^ uVar20;
  uVar11 = (uVar3 | uVar17) ^ uVar11;
  uVar9 = (uVar2 << 5 | uVar2 >> 0x3b) ^ uVar9;
  uVar10 = (uVar10 << 8 | uVar10 >> 0x38) ^ uVar9;
  uVar1 = (uVar20 << 0x2e | uVar20 >> 0x12) ^ uVar20 ^ (uVar9 << 0x11 | uVar9 >> 0x2f);
  uVar17 = uVar10 & uVar2 ^ uVar1;
  uVar3 = (~uVar1 | uVar10) ^ uVar2;
  uVar10 = (uVar1 | uVar2) ^ uVar10;
  uVar1 = uVar4 ^ uVar6 ^ uVar26;
  uVar4 = (uVar1 << 0x23 | uVar1 >> 0x1d) ^ uVar4;
  uVar6 = (uVar6 << 0x38 | uVar6 >> 8) ^ uVar4;
  uVar2 = (uVar26 << 2 | uVar26 >> 0x3e) ^ uVar26 ^ (uVar4 << 0x37 | uVar4 >> 9);
  uVar4 = uVar6 & uVar1 ^ uVar2;
  uVar18 = (~uVar2 | uVar6) ^ uVar1;
  uVar6 = (uVar2 | uVar1) ^ uVar6;
  uVar9 = uVar8 ^ 0x60e8b2ce0ddec97b ^ (~uVar29 | uVar31);
  uVar2 = uVar6 ^ uVar24 ^ uVar3;
  uVar24 = (uVar2 << 0x35 | uVar2 >> 0xb) ^ uVar24;
  uVar26 = (uVar6 << 8 | uVar6 >> 0x38) ^ uVar24;
  uVar24 = (uVar3 << 0xe | uVar3 >> 0x32) ^ uVar3 ^ (uVar24 << 1 | (ulong)((long)uVar24 < 0));
  uVar1 = uVar26 & uVar2 ^ uVar24;
  uVar6 = (~uVar24 | uVar26) ^ uVar2;
  uVar31 = uVar12 ^ uVar19 ^ uVar13;
  uVar26 = (uVar24 | uVar2) ^ uVar26;
  uVar19 = (uVar31 << 0x33 | uVar31 >> 0xd) ^ uVar19;
  uVar12 = (uVar12 << 0x38 | uVar12 >> 8) ^ uVar19;
  uVar30 = (uVar13 << 0x22 | uVar13 >> 0x1e) ^ uVar13 ^ (uVar19 << 7 | uVar19 >> 0x39);
  uVar24 = uVar12 & uVar31 ^ uVar30;
  uVar8 = (uVar30 | uVar31) ^ uVar12;
  uVar2 = uVar33 ^ uVar21 ^ uVar27;
  uVar21 = (uVar2 << 0x25 | uVar2 >> 0x1b) ^ uVar21;
  uVar13 = (uVar33 << 8 | uVar33 >> 0x38) ^ uVar21;
  uVar19 = (uVar27 << 0x2e | uVar27 >> 0x12) ^ uVar27 ^ (uVar21 << 0x31 | uVar21 >> 0xf);
  uVar25 = uVar13 & uVar2 ^ uVar19;
  uVar3 = (~uVar19 | uVar13) ^ uVar2;
  uVar13 = (uVar19 | uVar2) ^ uVar13;
  uVar19 = uVar22 ^ uVar5 ^ uVar32;
  uVar22 = (uVar19 << 3 | uVar19 >> 0x3d) ^ uVar22;
  uVar29 = (uVar5 << 0x38 | uVar5 >> 8) ^ uVar22;
  uVar5 = (uVar32 << 2 | uVar32 >> 0x3e) ^ uVar32 ^ (uVar22 << 0x17 | uVar22 >> 0x29);
  uVar2 = uVar29 & uVar19 ^ uVar5;
  uVar33 = (~uVar5 | uVar29) ^ uVar19;
  uVar21 = uVar23 ^ uVar7 ^ uVar28;
  uVar29 = (uVar5 | uVar19) ^ uVar29;
  uVar23 = (uVar21 << 0x15 | uVar21 >> 0x2b) ^ uVar23;
  uVar27 = (uVar7 << 8 | uVar7 >> 0x38) ^ uVar23;
  uVar19 = (uVar28 << 0xe | uVar28 >> 0x32) ^ uVar28 ^ (uVar23 << 0x21 | uVar23 >> 0x1f);
  uVar7 = uVar27 & uVar21 ^ uVar19;
  uVar5 = (~uVar19 | uVar27) ^ uVar21;
  uVar27 = (uVar19 | uVar21) ^ uVar27;
  uVar21 = uVar14 ^ uVar10 ^ uVar18;
  uVar14 = (uVar21 << 0x13 | uVar21 >> 0x2d) ^ uVar14;
  uVar20 = (uVar10 << 0x38 | uVar10 >> 8) ^ uVar14;
  uVar22 = (uVar18 << 0x22 | uVar18 >> 0x1e) ^ uVar18 ^ (uVar14 << 0x27 | uVar14 >> 0x19);
  uVar19 = uVar20 & uVar21 ^ uVar22;
  uVar18 = (~uVar22 | uVar20) ^ uVar21;
  uVar20 = (uVar22 | uVar21) ^ uVar20;
  uVar10 = uVar11 ^ uVar4 ^ uVar15;
  uVar4 = (uVar10 << 5 | uVar10 >> 0x3b) ^ uVar4;
  uVar28 = (uVar11 << 8 | uVar11 >> 0x38) ^ uVar4;
  uVar23 = (uVar15 << 0x2e | uVar15 >> 0x12) ^ uVar15 ^ (uVar4 << 0x11 | uVar4 >> 0x2f);
  uVar21 = uVar28 & uVar10 ^ uVar23;
  uVar22 = (~uVar23 | uVar28) ^ uVar10;
  uVar28 = (uVar23 | uVar10) ^ uVar28;
  uVar10 = uVar17 ^ uVar16 ^ uVar9;
  uVar17 = (uVar10 << 0x23 | uVar10 >> 0x1d) ^ uVar17;
  uVar23 = (uVar16 << 0x38 | uVar16 >> 8) ^ uVar17;
  uVar17 = (uVar9 << 2 | uVar9 >> 0x3e) ^ uVar9 ^ (uVar17 << 0x37 | uVar17 >> 9);
  uVar14 = uVar23 & uVar10 ^ uVar17;
  uVar15 = (~uVar17 | uVar23) ^ uVar10;
  uVar23 = (uVar17 | uVar10) ^ uVar23;
  uVar10 = uVar31 ^ 0xec5fb8fe790fbc13 ^ (~uVar30 | uVar12);
  uVar11 = uVar24 ^ uVar23 ^ uVar22;
  uVar24 = (uVar11 << 0x35 | uVar11 >> 0xb) ^ uVar24;
  uVar4 = (uVar23 << 8 | uVar23 >> 0x38) ^ uVar24;
  uVar22 = (uVar22 << 0xe | uVar22 >> 0x32) ^ uVar22 ^ (uVar24 << 1 | (ulong)((long)uVar24 < 0));
  uVar24 = uVar4 & uVar11 ^ uVar22;
  uVar17 = (~uVar22 | uVar4) ^ uVar11;
  uVar4 = (uVar22 | uVar11) ^ uVar4;
  uVar31 = uVar1 ^ uVar13 ^ uVar33;
  uVar1 = (uVar31 << 0x33 | uVar31 >> 0xd) ^ uVar1;
  uVar12 = (uVar13 << 0x38 | uVar13 >> 8) ^ uVar1;
  uVar33 = (uVar33 << 0x22 | uVar33 >> 0x1e) ^ uVar33 ^ (uVar1 << 7 | uVar1 >> 0x39);
  uVar22 = uVar12 & uVar31 ^ uVar33;
  uVar9 = uVar2 ^ uVar8 ^ uVar6;
  uVar11 = (uVar33 | uVar31) ^ uVar12;
  uVar2 = (uVar9 << 0x25 | uVar9 >> 0x1b) ^ uVar2;
  uVar13 = (uVar8 << 8 | uVar8 >> 0x38) ^ uVar2;
  uVar1 = (uVar6 << 0x2e | uVar6 >> 0x12) ^ uVar6 ^ (uVar2 << 0x31 | uVar2 >> 0xf);
  uVar6 = uVar13 & uVar9 ^ uVar1;
  uVar23 = (~uVar1 | uVar13) ^ uVar9;
  uVar13 = (uVar1 | uVar9) ^ uVar13;
  uVar9 = uVar25 ^ uVar27 ^ uVar18;
  uVar25 = (uVar9 << 3 | uVar9 >> 0x3d) ^ uVar25;
  uVar16 = (uVar27 << 0x38 | uVar27 >> 8) ^ uVar25;
  uVar25 = (uVar18 << 2 | uVar18 >> 0x3e) ^ uVar18 ^ (uVar25 << 0x17 | uVar25 >> 0x29);
  uVar1 = uVar16 & uVar9 ^ uVar25;
  uVar2 = (~uVar25 | uVar16) ^ uVar9;
  uVar16 = (uVar25 | uVar9) ^ uVar16;
  uVar18 = uVar29 ^ uVar19 ^ uVar3;
  uVar19 = (uVar18 << 0x15 | uVar18 >> 0x2b) ^ uVar19;
  uVar25 = (uVar29 << 8 | uVar29 >> 0x38) ^ uVar19;
  uVar3 = (uVar3 << 0xe | uVar3 >> 0x32) ^ uVar3 ^ (uVar19 << 0x21 | uVar19 >> 0x1f);
  uVar9 = uVar25 & uVar18 ^ uVar3;
  uVar27 = (~uVar3 | uVar25) ^ uVar18;
  uVar25 = (uVar3 | uVar18) ^ uVar25;
  uVar8 = uVar7 ^ uVar28 ^ uVar15;
  uVar7 = (uVar8 << 0x13 | uVar8 >> 0x2d) ^ uVar7;
  uVar18 = (uVar28 << 0x38 | uVar28 >> 8) ^ uVar7;
  uVar19 = (uVar15 << 0x22 | uVar15 >> 0x1e) ^ uVar15 ^ (uVar7 << 0x27 | uVar7 >> 0x19);
  uVar3 = uVar18 & uVar8 ^ uVar19;
  uVar29 = (~uVar19 | uVar18) ^ uVar8;
  uVar7 = uVar20 ^ uVar14 ^ uVar5;
  uVar18 = (uVar19 | uVar8) ^ uVar18;
  uVar14 = (uVar7 << 5 | uVar7 >> 0x3b) ^ uVar14;
  uVar15 = (uVar20 << 8 | uVar20 >> 0x38) ^ uVar14;
  uVar19 = (uVar5 << 0x2e | uVar5 >> 0x12) ^ uVar5 ^ (uVar14 << 0x11 | uVar14 >> 0x2f);
  uVar5 = uVar15 & uVar7 ^ uVar19;
  uVar20 = (~uVar19 | uVar15) ^ uVar7;
  uVar15 = (uVar19 | uVar7) ^ uVar15;
  uVar7 = uVar26 ^ uVar21 ^ uVar10;
  uVar21 = (uVar7 << 0x23 | uVar7 >> 0x1d) ^ uVar21;
  uVar14 = (uVar26 << 0x38 | uVar26 >> 8) ^ uVar21;
  uVar21 = (uVar10 << 2 | uVar10 >> 0x3e) ^ uVar10 ^ (uVar21 << 0x37 | uVar21 >> 9);
  uVar19 = uVar14 & uVar7 ^ uVar21;
  uVar8 = (~uVar21 | uVar14) ^ uVar7;
  uVar14 = (uVar21 | uVar7) ^ uVar14;
  uVar21 = uVar31 ^ 0xaa043de6436706a7 ^ (~uVar33 | uVar12);
  uVar10 = uVar22 ^ uVar14 ^ uVar20;
  uVar22 = (uVar10 << 0x35 | uVar10 >> 0xb) ^ uVar22;
  uVar28 = (uVar14 << 8 | uVar14 >> 0x38) ^ uVar22;
  uVar20 = (uVar20 << 0xe | uVar20 >> 0x32) ^ uVar20 ^ (uVar22 << 1 | (ulong)((long)uVar22 < 0));
  uVar7 = uVar28 & uVar10 ^ uVar20;
  uVar22 = (~uVar20 | uVar28) ^ uVar10;
  uVar14 = uVar24 ^ uVar13 ^ uVar2;
  uVar28 = (uVar20 | uVar10) ^ uVar28;
  uVar24 = (uVar14 << 0x33 | uVar14 >> 0xd) ^ uVar24;
  uVar33 = (uVar13 << 0x38 | uVar13 >> 8) ^ uVar24;
  uVar26 = (uVar2 << 0x22 | uVar2 >> 0x1e) ^ uVar2 ^ (uVar24 << 7 | uVar24 >> 0x39);
  uVar24 = uVar33 & uVar14 ^ uVar26;
  uVar31 = (uVar26 | uVar14) ^ uVar33;
  uVar2 = uVar11 ^ uVar1 ^ uVar17;
  uVar1 = (uVar2 << 0x25 | uVar2 >> 0x1b) ^ uVar1;
  uVar20 = (uVar11 << 8 | uVar11 >> 0x38) ^ uVar1;
  uVar10 = (uVar17 << 0x2e | uVar17 >> 0x12) ^ uVar17 ^ (uVar1 << 0x31 | uVar1 >> 0xf);
  uVar17 = uVar20 & uVar2 ^ uVar10;
  uVar1 = (~uVar10 | uVar20) ^ uVar2;
  uVar20 = (uVar10 | uVar2) ^ uVar20;
  uVar2 = uVar6 ^ uVar25 ^ uVar29;
  uVar6 = (uVar2 << 3 | uVar2 >> 0x3d) ^ uVar6;
  uVar12 = (uVar25 << 0x38 | uVar25 >> 8) ^ uVar6;
  uVar25 = (uVar29 << 2 | uVar29 >> 0x3e) ^ uVar29 ^ (uVar6 << 0x17 | uVar6 >> 0x29);
  uVar6 = uVar12 & uVar2 ^ uVar25;
  uVar29 = (~uVar25 | uVar12) ^ uVar2;
  uVar11 = uVar16 ^ uVar3 ^ uVar23;
  uVar12 = (uVar25 | uVar2) ^ uVar12;
  uVar3 = (uVar11 << 0x15 | uVar11 >> 0x2b) ^ uVar3;
  uVar10 = (uVar16 << 8 | uVar16 >> 0x38) ^ uVar3;
  uVar2 = (uVar23 << 0xe | uVar23 >> 0x32) ^ uVar23 ^ (uVar3 << 0x21 | uVar3 >> 0x1f);
  uVar3 = uVar10 & uVar11 ^ uVar2;
  uVar23 = (~uVar2 | uVar10) ^ uVar11;
  uVar10 = (uVar2 | uVar11) ^ uVar10;
  uVar2 = uVar15 ^ uVar9 ^ uVar8;
  uVar9 = (uVar2 << 0x13 | uVar2 >> 0x2d) ^ uVar9;
  uVar13 = (uVar15 << 0x38 | uVar15 >> 8) ^ uVar9;
  uVar9 = (uVar8 << 0x22 | uVar8 >> 0x1e) ^ uVar8 ^ (uVar9 << 0x27 | uVar9 >> 0x19);
  uVar25 = uVar13 & uVar2 ^ uVar9;
  uVar11 = (~uVar9 | uVar13) ^ uVar2;
  uVar13 = (uVar9 | uVar2) ^ uVar13;
  uVar8 = uVar18 ^ uVar19 ^ uVar27;
  uVar19 = (uVar8 << 5 | uVar8 >> 0x3b) ^ uVar19;
  uVar9 = (uVar18 << 8 | uVar18 >> 0x38) ^ uVar19;
  uVar18 = (uVar27 << 0x2e | uVar27 >> 0x12) ^ uVar27 ^ (uVar19 << 0x11 | uVar19 >> 0x2f);
  uVar19 = uVar9 & uVar8 ^ uVar18;
  uVar2 = (~uVar18 | uVar9) ^ uVar8;
  uVar9 = (uVar18 | uVar8) ^ uVar9;
  uVar18 = uVar5 ^ uVar4 ^ uVar21;
  uVar5 = (uVar18 << 0x23 | uVar18 >> 0x1d) ^ uVar5;
  uVar16 = (uVar4 << 0x38 | uVar4 >> 8) ^ uVar5;
  uVar5 = (uVar21 << 2 | uVar21 >> 0x3e) ^ uVar21 ^ (uVar5 << 0x37 | uVar5 >> 9);
  uVar8 = uVar16 & uVar18 ^ uVar5;
  uVar27 = (~uVar5 | uVar16) ^ uVar18;
  uVar16 = (uVar5 | uVar18) ^ uVar16;
  uVar4 = uVar14 ^ 0x8929ff6a5e535bfd ^ (~uVar26 | uVar33);
  uVar5 = uVar16 ^ uVar24 ^ uVar2;
  uVar24 = (uVar5 << 0x35 | uVar5 >> 0xb) ^ uVar24;
  uVar26 = (uVar16 << 8 | uVar16 >> 0x38) ^ uVar24;
  uVar21 = (uVar2 << 0xe | uVar2 >> 0x32) ^ uVar2 ^ (uVar24 << 1 | (ulong)((long)uVar24 < 0));
  uVar2 = uVar26 & uVar5 ^ uVar21;
  uVar24 = (~uVar21 | uVar26) ^ uVar5;
  uVar26 = (uVar21 | uVar5) ^ uVar26;
  uVar33 = uVar7 ^ uVar20 ^ uVar29;
  uVar7 = (uVar33 << 0x33 | uVar33 >> 0xd) ^ uVar7;
  uVar15 = (uVar20 << 0x38 | uVar20 >> 8) ^ uVar7;
  uVar16 = (uVar29 << 0x22 | uVar29 >> 0x1e) ^ uVar29 ^ (uVar7 << 7 | uVar7 >> 0x39);
  uVar5 = uVar15 & uVar33 ^ uVar16;
  uVar7 = uVar31 ^ uVar6 ^ uVar22;
  uVar30 = (uVar16 | uVar33) ^ uVar15;
  uVar6 = (uVar7 << 0x25 | uVar7 >> 0x1b) ^ uVar6;
  uVar21 = (uVar31 << 8 | uVar31 >> 0x38) ^ uVar6;
  uVar6 = (uVar22 << 0x2e | uVar22 >> 0x12) ^ uVar22 ^ (uVar6 << 0x31 | uVar6 >> 0xf);
  uVar20 = uVar21 & uVar7 ^ uVar6;
  uVar18 = (~uVar6 | uVar21) ^ uVar7;
  uVar21 = (uVar6 | uVar7) ^ uVar21;
  uVar22 = uVar10 ^ uVar17 ^ uVar11;
  uVar17 = (uVar22 << 3 | uVar22 >> 0x3d) ^ uVar17;
  uVar6 = (uVar10 << 0x38 | uVar10 >> 8) ^ uVar17;
  uVar17 = (uVar11 << 2 | uVar11 >> 0x3e) ^ uVar11 ^ (uVar17 << 0x17 | uVar17 >> 0x29);
  uVar7 = uVar6 & uVar22 ^ uVar17;
  uVar14 = (~uVar17 | uVar6) ^ uVar22;
  uVar6 = (uVar17 | uVar22) ^ uVar6;
  uVar10 = uVar12 ^ uVar25 ^ uVar1;
  uVar25 = (uVar10 << 0x15 | uVar10 >> 0x2b) ^ uVar25;
  uVar12 = (uVar12 << 8 | uVar12 >> 0x38) ^ uVar25;
  uVar1 = (uVar1 << 0xe | uVar1 >> 0x32) ^ uVar1 ^ (uVar25 << 0x21 | uVar25 >> 0x1f);
  uVar17 = uVar12 & uVar10 ^ uVar1;
  uVar22 = (~uVar1 | uVar12) ^ uVar10;
  uVar12 = (uVar1 | uVar10) ^ uVar12;
  uVar25 = uVar3 ^ uVar9 ^ uVar27;
  uVar3 = (uVar25 << 0x13 | uVar25 >> 0x2d) ^ uVar3;
  uVar29 = (uVar9 << 0x38 | uVar9 >> 8) ^ uVar3;
  uVar3 = (uVar27 << 0x22 | uVar27 >> 0x1e) ^ uVar27 ^ (uVar3 << 0x27 | uVar3 >> 0x19);
  uVar1 = uVar29 & uVar25 ^ uVar3;
  uVar27 = (~uVar3 | uVar29) ^ uVar25;
  uVar10 = uVar8 ^ uVar13 ^ uVar23;
  uVar29 = (uVar3 | uVar25) ^ uVar29;
  uVar8 = (uVar10 << 5 | uVar10 >> 0x3b) ^ uVar8;
  uVar31 = (uVar13 << 8 | uVar13 >> 0x38) ^ uVar8;
  uVar25 = (uVar23 << 0x2e | uVar23 >> 0x12) ^ uVar23 ^ (uVar8 << 0x11 | uVar8 >> 0x2f);
  uVar3 = uVar31 & uVar10 ^ uVar25;
  uVar23 = (~uVar25 | uVar31) ^ uVar10;
  uVar31 = (uVar25 | uVar10) ^ uVar31;
  uVar11 = uVar19 ^ uVar28 ^ uVar4;
  uVar19 = (uVar11 << 0x23 | uVar11 >> 0x1d) ^ uVar19;
  uVar25 = (uVar28 << 0x38 | uVar28 >> 8) ^ uVar19;
  uVar19 = (uVar4 << 2 | uVar4 >> 0x3e) ^ uVar4 ^ (uVar19 << 0x37 | uVar19 >> 9);
  uVar10 = uVar25 & uVar11 ^ uVar19;
  uVar9 = (~uVar19 | uVar25) ^ uVar11;
  uVar25 = (uVar19 | uVar11) ^ uVar25;
  uVar15 = uVar33 ^ 0x98bf1e2c50c97550 ^ (~uVar16 | uVar15);
  uVar4 = uVar25 ^ uVar5 ^ uVar23;
  uVar5 = (uVar4 << 0x35 | uVar4 >> 0xb) ^ uVar5;
  uVar16 = (uVar25 << 8 | uVar25 >> 0x38) ^ uVar5;
  uVar19 = (uVar23 << 0xe | uVar23 >> 0x32) ^ uVar23 ^ (uVar5 << 1 | (ulong)((long)uVar5 < 0));
  uVar25 = uVar16 & uVar4 ^ uVar19;
  uVar5 = (~uVar19 | uVar16) ^ uVar4;
  uVar11 = uVar21 ^ uVar2 ^ uVar14;
  uVar16 = (uVar19 | uVar4) ^ uVar16;
  uVar2 = (uVar11 << 0x33 | uVar11 >> 0xd) ^ uVar2;
  uVar13 = (uVar21 << 0x38 | uVar21 >> 8) ^ uVar2;
  uVar33 = (uVar14 << 0x22 | uVar14 >> 0x1e) ^ uVar14 ^ (uVar2 << 7 | uVar2 >> 0x39);
  uVar19 = uVar13 & uVar11 ^ uVar33;
  uVar32 = (uVar33 | uVar11) ^ uVar13;
  uVar23 = uVar30 ^ uVar7 ^ uVar24;
  uVar7 = (uVar23 << 0x25 | uVar23 >> 0x1b) ^ uVar7;
  uVar4 = (uVar30 << 8 | uVar30 >> 0x38) ^ uVar7;
  uVar2 = (uVar24 << 0x2e | uVar24 >> 0x12) ^ uVar24 ^ (uVar7 << 0x31 | uVar7 >> 0xf);
  uVar24 = uVar4 & uVar23 ^ uVar2;
  uVar21 = (~uVar2 | uVar4) ^ uVar23;
  uVar4 = (uVar2 | uVar23) ^ uVar4;
  uVar23 = uVar20 ^ uVar12 ^ uVar27;
  uVar20 = (uVar23 << 3 | uVar23 >> 0x3d) ^ uVar20;
  uVar28 = (uVar12 << 0x38 | uVar12 >> 8) ^ uVar20;
  uVar20 = (uVar27 << 2 | uVar27 >> 0x3e) ^ uVar27 ^ (uVar20 << 0x17 | uVar20 >> 0x29);
  uVar7 = uVar28 & uVar23 ^ uVar20;
  uVar8 = (~uVar20 | uVar28) ^ uVar23;
  uVar2 = uVar1 ^ uVar6 ^ uVar18;
  uVar28 = (uVar20 | uVar23) ^ uVar28;
  uVar1 = (uVar2 << 0x15 | uVar2 >> 0x2b) ^ uVar1;
  uVar14 = (uVar6 << 8 | uVar6 >> 0x38) ^ uVar1;
  uVar1 = (uVar18 << 0xe | uVar18 >> 0x32) ^ uVar18 ^ (uVar1 << 0x21 | uVar1 >> 0x1f);
  uVar6 = uVar14 & uVar2 ^ uVar1;
  uVar23 = (~uVar1 | uVar14) ^ uVar2;
  uVar14 = (uVar1 | uVar2) ^ uVar14;
  uVar1 = uVar17 ^ uVar31 ^ uVar9;
  uVar17 = (uVar1 << 0x13 | uVar1 >> 0x2d) ^ uVar17;
  uVar12 = (uVar31 << 0x38 | uVar31 >> 8) ^ uVar17;
  uVar2 = (uVar9 << 0x22 | uVar9 >> 0x1e) ^ uVar9 ^ (uVar17 << 0x27 | uVar17 >> 0x19);
  uVar17 = uVar12 & uVar1 ^ uVar2;
  uVar18 = (~uVar2 | uVar12) ^ uVar1;
  uVar12 = (uVar2 | uVar1) ^ uVar12;
  uVar2 = uVar29 ^ uVar10 ^ uVar22;
  uVar10 = (uVar2 << 5 | uVar2 >> 0x3b) ^ uVar10;
  uVar9 = (uVar29 << 8 | uVar29 >> 0x38) ^ uVar10;
  uVar1 = (uVar22 << 0x2e | uVar22 >> 0x12) ^ uVar22 ^ (uVar10 << 0x11 | uVar10 >> 0x2f);
  uVar22 = uVar9 & uVar2 ^ uVar1;
  uVar10 = (~uVar1 | uVar9) ^ uVar2;
  uVar9 = (uVar1 | uVar2) ^ uVar9;
  uVar2 = uVar3 ^ uVar26 ^ uVar15;
  uVar3 = (uVar2 << 0x23 | uVar2 >> 0x1d) ^ uVar3;
  uVar1 = (uVar26 << 0x38 | uVar26 >> 8) ^ uVar3;
  uVar3 = (uVar15 << 2 | uVar15 >> 0x3e) ^ uVar15 ^ (uVar3 << 0x37 | uVar3 >> 9);
  uVar20 = uVar1 & uVar2 ^ uVar3;
  uVar15 = (~uVar3 | uVar1) ^ uVar2;
  uVar1 = (uVar3 | uVar2) ^ uVar1;
  uVar3 = uVar11 ^ 0x4c5f8f162864baa8 ^ (~uVar33 | uVar13);
  uVar2 = uVar19 ^ uVar1 ^ uVar10;
  uVar19 = (uVar2 << 0x35 | uVar2 >> 0xb) ^ uVar19;
  uVar1 = (uVar1 << 8 | uVar1 >> 0x38) ^ uVar19;
  uVar19 = (uVar10 << 0xe | uVar10 >> 0x32) ^ uVar10 ^ (uVar19 << 1 | (ulong)((long)uVar19 < 0));
  uVar10 = uVar1 & uVar2 ^ uVar19;
  s[0x16] = (~uVar19 | uVar1) ^ uVar2;
  uVar13 = uVar25 ^ uVar4 ^ uVar8;
  s[3] = (uVar19 | uVar2) ^ uVar1;
  uVar25 = (uVar13 << 0x33 | uVar13 >> 0xd) ^ uVar25;
  uVar19 = (uVar4 << 0x38 | uVar4 >> 8) ^ uVar25;
  uVar2 = (uVar8 << 0x22 | uVar8 >> 0x1e) ^ uVar8 ^ (uVar25 << 7 | uVar25 >> 0x39);
  uVar4 = uVar19 & uVar13 ^ uVar2;
  s[6] = (uVar2 | uVar13) ^ uVar19;
  uVar1 = uVar7 ^ uVar32 ^ uVar5;
  uVar7 = (uVar1 << 0x25 | uVar1 >> 0x1b) ^ uVar7;
  uVar11 = (uVar32 << 8 | uVar32 >> 0x38) ^ uVar7;
  uVar5 = (uVar5 << 0x2e | uVar5 >> 0x12) ^ uVar5 ^ (uVar7 << 0x31 | uVar7 >> 0xf);
  s[0x10] = (~uVar5 | uVar11) ^ uVar1;
  uVar25 = (uVar5 | uVar1) ^ uVar11;
  uVar7 = uVar24 ^ uVar14 ^ uVar18;
  s[0xf] = uVar11 & uVar1 ^ uVar5;
  uVar24 = (uVar7 << 3 | uVar7 >> 0x3d) ^ uVar24;
  uVar5 = (uVar14 << 0x38 | uVar14 >> 8) ^ uVar24;
  uVar24 = (uVar18 << 2 | uVar18 >> 0x3e) ^ uVar18 ^ (uVar24 << 0x17 | uVar24 >> 0x29);
  uVar1 = uVar5 & uVar7 ^ uVar24;
  uVar11 = (~uVar24 | uVar5) ^ uVar7;
  uVar18 = uVar28 ^ uVar17 ^ uVar21;
  *s = (uVar24 | uVar7) ^ uVar5;
  uVar17 = (uVar18 << 0x15 | uVar18 >> 0x2b) ^ uVar17;
  uVar24 = (uVar28 << 8 | uVar28 >> 0x38) ^ uVar17;
  uVar5 = (uVar21 << 0xe | uVar21 >> 0x32) ^ uVar21 ^ (uVar17 << 0x21 | uVar17 >> 0x1f);
  s[0xe] = uVar1;
  s[0x12] = (~uVar5 | uVar24) ^ uVar18;
  s[7] = (uVar5 | uVar18) ^ uVar24;
  s[9] = uVar24 & uVar18 ^ uVar5;
  uVar24 = uVar6 ^ uVar9 ^ uVar15;
  uVar6 = (uVar24 << 0x13 | uVar24 >> 0x2d) ^ uVar6;
  uVar5 = (uVar9 << 0x38 | uVar9 >> 8) ^ uVar6;
  uVar6 = (uVar15 << 0x22 | uVar15 >> 0x1e) ^ uVar15 ^ (uVar6 << 0x27 | uVar6 >> 0x19);
  s[0x17] = (~uVar6 | uVar5) ^ uVar24;
  s[2] = (uVar6 | uVar24) ^ uVar5;
  s[8] = uVar5 & uVar24 ^ uVar6;
  uVar24 = uVar12 ^ uVar20 ^ uVar23;
  uVar20 = (uVar24 << 5 | uVar24 >> 0x3b) ^ uVar20;
  uVar17 = (uVar12 << 8 | uVar12 >> 0x38) ^ uVar20;
  uVar21 = (uVar23 << 0x2e | uVar23 >> 0x12) ^ uVar23 ^ (uVar20 << 0x11 | uVar20 >> 0x2f);
  uVar6 = (~uVar21 | uVar17) ^ uVar24;
  s[1] = (uVar21 | uVar24) ^ uVar17;
  uVar5 = uVar16 ^ uVar22 ^ uVar3;
  s[0xb] = uVar17 & uVar24 ^ uVar21;
  uVar22 = (uVar5 << 0x23 | uVar5 >> 0x1d) ^ uVar22;
  uVar17 = (uVar16 << 0x38 | uVar16 >> 8) ^ uVar22;
  uVar3 = (uVar3 << 2 | uVar3 >> 0x3e) ^ uVar3 ^ (uVar22 << 0x37 | uVar22 >> 9);
  s[0x11] = (~uVar3 | uVar17) ^ uVar5;
  uVar24 = (uVar3 | uVar5) ^ uVar17;
  s[10] = uVar17 & uVar5 ^ uVar3;
  uVar5 = uVar4 ^ uVar24 ^ uVar6;
  uVar4 = (uVar5 << 0x35 | uVar5 >> 0xb) ^ uVar4;
  uVar24 = (uVar24 << 8 | uVar24 >> 0x38) ^ uVar4;
  s[0x13] = uVar13 ^ 0x262fc78b14325d54 ^ (~uVar2 | uVar19);
  uVar6 = (uVar6 << 0xe | uVar6 >> 0x32) ^ uVar6 ^ (uVar4 << 1 | (ulong)((long)uVar4 < 0));
  s[4] = (~uVar6 | uVar24) ^ uVar5;
  s[0xc] = (uVar6 | uVar5) ^ uVar24;
  s[0x14] = uVar24 & uVar5 ^ uVar6;
  uVar6 = uVar10 ^ uVar25 ^ uVar11;
  uVar10 = (uVar6 << 0x33 | uVar6 >> 0xd) ^ uVar10;
  uVar24 = (uVar25 << 0x38 | uVar25 >> 8) ^ uVar10;
  uVar5 = (uVar11 << 0x22 | uVar11 >> 0x1e) ^ uVar11 ^ (uVar10 << 7 | uVar10 >> 0x39);
  s[5] = (~uVar5 | uVar24) ^ uVar6;
  s[0xd] = (uVar6 | uVar5) ^ uVar24;
  s[0x15] = uVar24 & uVar6 ^ uVar5;
  uVar6 = s[6];
  uVar24 = s[0x16];
  uVar17 = uVar6 ^ uVar24 ^ uVar1;
  uVar1 = (uVar17 << 0x25 | uVar17 >> 0x1b) ^ uVar1;
  uVar5 = (uVar6 << 8 | uVar6 >> 0x38) ^ uVar1;
  uVar6 = *s;
  uVar24 = (uVar24 << 0x2e | uVar24 >> 0x12) ^ uVar24 ^ (uVar1 << 0x31 | uVar1 >> 0xf);
  s[6] = (~uVar24 | uVar5) ^ uVar17;
  s[0xe] = (uVar24 | uVar17) ^ uVar5;
  s[0x16] = uVar5 & uVar17 ^ uVar24;
  uVar24 = s[7];
  uVar5 = s[0x17];
  uVar17 = uVar24 ^ uVar5 ^ s[0xf];
  uVar3 = (uVar17 << 3 | uVar17 >> 0x3d) ^ s[0xf];
  uVar24 = (uVar24 << 0x38 | uVar24 >> 8) ^ uVar3;
  uVar5 = (uVar5 << 2 | uVar5 >> 0x3e) ^ uVar5 ^ (uVar3 << 0x17 | uVar3 >> 0x29);
  s[7] = (~uVar5 | uVar24) ^ uVar17;
  s[0xf] = (uVar5 | uVar17) ^ uVar24;
  s[0x17] = uVar24 & uVar17 ^ uVar5;
  uVar24 = s[0x10];
  uVar5 = uVar6 ^ uVar24 ^ s[8];
  uVar17 = (uVar5 << 0x15 | uVar5 >> 0x2b) ^ s[8];
  uVar6 = (uVar6 << 8 | uVar6 >> 0x38) ^ uVar17;
  uVar24 = (uVar24 << 0xe | uVar24 >> 0x32) ^ uVar24 ^ (uVar17 << 0x21 | uVar17 >> 0x1f);
  *s = (~uVar24 | uVar6) ^ uVar5;
  s[8] = (uVar24 | uVar5) ^ uVar6;
  s[0x10] = uVar6 & uVar5 ^ uVar24;
  uVar6 = s[1];
  uVar24 = s[0x11];
  uVar5 = uVar6 ^ uVar24 ^ s[9];
  uVar17 = (uVar5 << 0x13 | uVar5 >> 0x2d) ^ s[9];
  uVar6 = (uVar6 << 0x38 | uVar6 >> 8) ^ uVar17;
  uVar24 = (uVar24 << 0x22 | uVar24 >> 0x1e) ^ uVar24 ^ (uVar17 << 0x27 | uVar17 >> 0x19);
  s[1] = (~uVar24 | uVar6) ^ uVar5;
  s[9] = (uVar24 | uVar5) ^ uVar6;
  s[0x11] = uVar6 & uVar5 ^ uVar24;
  uVar6 = s[2];
  uVar24 = s[0x12];
  uVar5 = uVar6 ^ uVar24 ^ s[10];
  uVar3 = (uVar5 << 5 | uVar5 >> 0x3b) ^ s[10];
  uVar17 = (uVar6 << 8 | uVar6 >> 0x38) ^ uVar3;
  uVar21 = (uVar24 << 0x2e | uVar24 >> 0x12) ^ uVar24 ^ (uVar3 << 0x11 | uVar3 >> 0x2f);
  s[10] = (uVar21 | uVar5) ^ uVar17;
  s[0x12] = uVar17 & uVar5 ^ uVar21;
  uVar6 = s[3];
  uVar24 = s[0x13];
  uVar3 = uVar6 ^ uVar24 ^ s[0xb];
  uVar22 = (uVar3 << 0x23 | uVar3 >> 0x1d) ^ s[0xb];
  uVar19 = (uVar6 << 0x38 | uVar6 >> 8) ^ uVar22;
  uVar5 = (~uVar21 | uVar17) ^ uVar5;
  uVar24 = (uVar24 << 2 | uVar24 >> 0x3e) ^ uVar24 ^ (uVar22 << 0x37 | uVar22 >> 9);
  s[3] = (~uVar24 | uVar19) ^ uVar3;
  uVar6 = (uVar24 | uVar3) ^ uVar19;
  s[0x13] = uVar19 & uVar3 ^ uVar24;
  s[5] = s[5] ^ 0x1317e3c58a192eaa;
  uVar24 = uVar6 ^ s[0x15] ^ uVar5;
  uVar17 = (uVar24 << 0x35 | uVar24 >> 0xb) ^ s[0x15];
  uVar6 = (uVar6 << 8 | uVar6 >> 0x38) ^ uVar17;
  uVar5 = (uVar5 << 0xe | uVar5 >> 0x32) ^ uVar5 ^ (uVar17 << 1 | (ulong)((long)uVar17 < 0));
  s[0xb] = (~uVar5 | uVar6) ^ uVar24;
  s[0x15] = (uVar5 | uVar24) ^ uVar6;
  s[2] = uVar6 & uVar24 ^ uVar5;
  uVar6 = s[0xe];
  uVar24 = s[7];
  uVar5 = uVar6 ^ uVar24 ^ s[0x14];
  uVar17 = (uVar5 << 0x33 | uVar5 >> 0xd) ^ s[0x14];
  uVar6 = (uVar6 << 0x38 | uVar6 >> 8) ^ uVar17;
  uVar24 = (uVar24 << 0x22 | uVar24 >> 0x1e) ^ uVar24 ^ (uVar17 << 7 | uVar17 >> 0x39);
  s[0xe] = (~uVar24 | uVar6) ^ uVar5;
  s[0x14] = (uVar24 | uVar5) ^ uVar6;
  s[7] = uVar6 & uVar5 ^ uVar24;
  uVar6 = s[4];
  uVar24 = s[0xd];
  uVar5 = uVar24 ^ uVar6 ^ s[0x17];
  uVar17 = (uVar5 << 0x25 | uVar5 >> 0x1b) ^ s[0x17];
  uVar24 = (uVar24 << 8 | uVar24 >> 0x38) ^ uVar17;
  uVar6 = (uVar6 << 0x2e | uVar6 >> 0x12) ^ uVar6 ^ (uVar17 << 0x31 | uVar17 >> 0xf);
  s[0xd] = (~uVar6 | uVar24) ^ uVar5;
  s[0x17] = (uVar6 | uVar5) ^ uVar24;
  s[4] = uVar24 & uVar5 ^ uVar6;
  uVar6 = s[8];
  uVar24 = s[1];
  uVar5 = uVar6 ^ uVar24 ^ s[0x16];
  uVar17 = (uVar5 << 3 | uVar5 >> 0x3d) ^ s[0x16];
  uVar6 = (uVar6 << 0x38 | uVar6 >> 8) ^ uVar17;
  uVar24 = (uVar24 << 2 | uVar24 >> 0x3e) ^ uVar24 ^ (uVar17 << 0x17 | uVar17 >> 0x29);
  s[8] = (~uVar24 | uVar6) ^ uVar5;
  s[0x16] = (uVar24 | uVar5) ^ uVar6;
  s[1] = uVar6 & uVar5 ^ uVar24;
  uVar6 = s[6];
  uVar24 = s[0xf];
  uVar5 = uVar24 ^ uVar6 ^ s[0x11];
  uVar17 = (uVar5 << 0x15 | uVar5 >> 0x2b) ^ s[0x11];
  uVar24 = (uVar24 << 8 | uVar24 >> 0x38) ^ uVar17;
  uVar6 = (uVar6 << 0xe | uVar6 >> 0x32) ^ uVar6 ^ (uVar17 << 0x21 | uVar17 >> 0x1f);
  s[0xf] = (~uVar6 | uVar24) ^ uVar5;
  s[0x11] = (uVar6 | uVar5) ^ uVar24;
  s[6] = uVar24 & uVar5 ^ uVar6;
  uVar6 = s[10];
  uVar24 = s[3];
  uVar5 = uVar6 ^ uVar24 ^ s[0x10];
  uVar17 = (uVar5 << 0x13 | uVar5 >> 0x2d) ^ s[0x10];
  uVar6 = (uVar6 << 0x38 | uVar6 >> 8) ^ uVar17;
  uVar24 = (uVar24 << 0x22 | uVar24 >> 0x1e) ^ uVar24 ^ (uVar17 << 0x27 | uVar17 >> 0x19);
  s[10] = (~uVar24 | uVar6) ^ uVar5;
  s[0x10] = (uVar24 | uVar5) ^ uVar6;
  s[3] = uVar6 & uVar5 ^ uVar24;
  uVar6 = *s;
  uVar24 = s[9];
  uVar5 = uVar24 ^ uVar6 ^ s[0x13];
  uVar3 = (uVar5 << 5 | uVar5 >> 0x3b) ^ s[0x13];
  uVar17 = (uVar24 << 8 | uVar24 >> 0x38) ^ uVar3;
  uVar3 = (uVar6 << 0x2e | uVar6 >> 0x12) ^ uVar6 ^ (uVar3 << 0x11 | uVar3 >> 0x2f);
  s[0x13] = (uVar3 | uVar5) ^ uVar17;
  *s = uVar17 & uVar5 ^ uVar3;
  uVar6 = s[5];
  uVar24 = s[0xc];
  uVar21 = uVar24 ^ uVar6 ^ s[0x12];
  uVar22 = (uVar21 << 0x23 | uVar21 >> 0x1d) ^ s[0x12];
  uVar19 = (uVar24 << 0x38 | uVar24 >> 8) ^ uVar22;
  uVar5 = (~uVar3 | uVar17) ^ uVar5;
  uVar24 = (uVar6 << 2 | uVar6 >> 0x3e) ^ uVar6 ^ (uVar22 << 0x37 | uVar22 >> 9);
  s[0xc] = (~uVar24 | uVar19) ^ uVar21;
  uVar6 = (uVar24 | uVar21) ^ uVar19;
  s[5] = uVar19 & uVar21 ^ uVar24;
  s[0xe] = s[0xe] ^ 0x98bf1e2c50c9755;
  uVar24 = uVar6 ^ s[7] ^ uVar5;
  uVar17 = (uVar24 << 0x35 | uVar24 >> 0xb) ^ s[7];
  uVar6 = (uVar6 << 8 | uVar6 >> 0x38) ^ uVar17;
  uVar5 = (uVar5 << 0xe | uVar5 >> 0x32) ^ uVar5 ^ (uVar17 << 1 | (ulong)((long)uVar17 < 0));
  s[0x12] = (~uVar5 | uVar6) ^ uVar24;
  s[7] = (uVar5 | uVar24) ^ uVar6;
  s[9] = uVar6 & uVar24 ^ uVar5;
  uVar6 = s[0x17];
  uVar24 = s[8];
  uVar5 = uVar6 ^ uVar24 ^ s[2];
  uVar17 = (uVar5 << 0x33 | uVar5 >> 0xd) ^ s[2];
  uVar6 = (uVar6 << 0x38 | uVar6 >> 8) ^ uVar17;
  uVar24 = (uVar24 << 0x22 | uVar24 >> 0x1e) ^ uVar24 ^ (uVar17 << 7 | uVar17 >> 0x39);
  s[0x17] = (~uVar24 | uVar6) ^ uVar5;
  s[2] = (uVar24 | uVar5) ^ uVar6;
  s[8] = uVar6 & uVar5 ^ uVar24;
  uVar6 = s[0x14];
  uVar24 = s[0xb];
  uVar5 = uVar6 ^ uVar24 ^ s[1];
  uVar17 = (uVar5 << 0x25 | uVar5 >> 0x1b) ^ s[1];
  uVar6 = (uVar6 << 8 | uVar6 >> 0x38) ^ uVar17;
  uVar24 = (uVar24 << 0x2e | uVar24 >> 0x12) ^ uVar24 ^ (uVar17 << 0x31 | uVar17 >> 0xf);
  s[0x14] = (~uVar24 | uVar6) ^ uVar5;
  s[1] = (uVar24 | uVar5) ^ uVar6;
  s[0xb] = uVar6 & uVar5 ^ uVar24;
  uVar6 = s[0x11];
  uVar24 = s[10];
  uVar5 = uVar6 ^ uVar24 ^ s[4];
  uVar17 = (uVar5 << 3 | uVar5 >> 0x3d) ^ s[4];
  uVar6 = (uVar6 << 0x38 | uVar6 >> 8) ^ uVar17;
  uVar24 = (uVar24 << 2 | uVar24 >> 0x3e) ^ uVar24 ^ (uVar17 << 0x17 | uVar17 >> 0x29);
  s[0x11] = (~uVar24 | uVar6) ^ uVar5;
  s[4] = (uVar24 | uVar5) ^ uVar6;
  s[10] = uVar6 & uVar5 ^ uVar24;
  uVar6 = s[0x16];
  uVar24 = s[0xd];
  uVar5 = uVar6 ^ uVar24 ^ s[3];
  uVar17 = (uVar5 << 0x15 | uVar5 >> 0x2b) ^ s[3];
  uVar6 = (uVar6 << 8 | uVar6 >> 0x38) ^ uVar17;
  uVar24 = (uVar24 << 0xe | uVar24 >> 0x32) ^ uVar24 ^ (uVar17 << 0x21 | uVar17 >> 0x1f);
  s[0x16] = (~uVar24 | uVar6) ^ uVar5;
  s[3] = (uVar24 | uVar5) ^ uVar6;
  s[0xd] = uVar6 & uVar5 ^ uVar24;
  uVar6 = s[0x13];
  uVar24 = s[0xc];
  uVar5 = uVar6 ^ uVar24 ^ s[6];
  uVar17 = (uVar5 << 0x13 | uVar5 >> 0x2d) ^ s[6];
  uVar6 = (uVar6 << 0x38 | uVar6 >> 8) ^ uVar17;
  uVar24 = (uVar24 << 0x22 | uVar24 >> 0x1e) ^ uVar24 ^ (uVar17 << 0x27 | uVar17 >> 0x19);
  s[0x13] = (~uVar24 | uVar6) ^ uVar5;
  s[6] = (uVar24 | uVar5) ^ uVar6;
  s[0xc] = uVar6 & uVar5 ^ uVar24;
  uVar6 = s[0x10];
  uVar24 = s[0xf];
  uVar5 = uVar6 ^ uVar24 ^ s[5];
  uVar3 = (uVar5 << 5 | uVar5 >> 0x3b) ^ s[5];
  uVar17 = (uVar6 << 8 | uVar6 >> 0x38) ^ uVar3;
  uVar21 = (uVar24 << 0x2e | uVar24 >> 0x12) ^ uVar24 ^ (uVar3 << 0x11 | uVar3 >> 0x2f);
  s[5] = (uVar21 | uVar5) ^ uVar17;
  s[0xf] = uVar17 & uVar5 ^ uVar21;
  uVar6 = s[0x15];
  uVar24 = s[0xe];
  uVar19 = uVar6 ^ uVar24 ^ *s;
  uVar22 = (uVar19 << 0x23 | uVar19 >> 0x1d) ^ *s;
  uVar3 = (uVar6 << 0x38 | uVar6 >> 8) ^ uVar22;
  uVar5 = (~uVar21 | uVar17) ^ uVar5;
  uVar24 = (uVar24 << 2 | uVar24 >> 0x3e) ^ uVar24 ^ (uVar22 << 0x37 | uVar22 >> 9);
  s[0x15] = (~uVar24 | uVar3) ^ uVar19;
  uVar6 = (uVar24 | uVar19) ^ uVar3;
  s[0xe] = uVar3 & uVar19 ^ uVar24;
  s[0x17] = s[0x17] ^ 0xd8ee19681d669304;
  uVar24 = uVar6 ^ s[8] ^ uVar5;
  uVar17 = (uVar24 << 0x35 | uVar24 >> 0xb) ^ s[8];
  uVar6 = (uVar6 << 8 | uVar6 >> 0x38) ^ uVar17;
  uVar5 = (uVar5 << 0xe | uVar5 >> 0x32) ^ uVar5 ^ (uVar17 << 1 | (ulong)((long)uVar17 < 0));
  *s = (~uVar5 | uVar6) ^ uVar24;
  s[8] = (uVar5 | uVar24) ^ uVar6;
  s[0x10] = uVar6 & uVar24 ^ uVar5;
  uVar6 = s[1];
  uVar24 = s[0x11];
  uVar5 = uVar6 ^ uVar24 ^ s[9];
  uVar17 = (uVar5 << 0x33 | uVar5 >> 0xd) ^ s[9];
  uVar6 = (uVar6 << 0x38 | uVar6 >> 8) ^ uVar17;
  uVar24 = (uVar24 << 0x22 | uVar24 >> 0x1e) ^ uVar24 ^ (uVar17 << 7 | uVar17 >> 0x39);
  s[1] = (~uVar24 | uVar6) ^ uVar5;
  s[9] = (uVar24 | uVar5) ^ uVar6;
  s[0x11] = uVar6 & uVar5 ^ uVar24;
  uVar6 = s[2];
  uVar24 = s[0x12];
  uVar5 = uVar6 ^ uVar24 ^ s[10];
  uVar17 = (uVar5 << 0x25 | uVar5 >> 0x1b) ^ s[10];
  uVar6 = (uVar6 << 8 | uVar6 >> 0x38) ^ uVar17;
  uVar24 = (uVar24 << 0x2e | uVar24 >> 0x12) ^ uVar24 ^ (uVar17 << 0x31 | uVar17 >> 0xf);
  s[2] = (~uVar24 | uVar6) ^ uVar5;
  s[10] = (uVar24 | uVar5) ^ uVar6;
  s[0x12] = uVar6 & uVar5 ^ uVar24;
  uVar6 = s[3];
  uVar24 = s[0x13];
  uVar5 = uVar6 ^ uVar24 ^ s[0xb];
  uVar17 = (uVar5 << 3 | uVar5 >> 0x3d) ^ s[0xb];
  uVar6 = (uVar6 << 0x38 | uVar6 >> 8) ^ uVar17;
  uVar24 = (uVar24 << 2 | uVar24 >> 0x3e) ^ uVar24 ^ (uVar17 << 0x17 | uVar17 >> 0x29);
  s[3] = (~uVar24 | uVar6) ^ uVar5;
  s[0xb] = (uVar24 | uVar5) ^ uVar6;
  s[0x13] = uVar6 & uVar5 ^ uVar24;
  uVar6 = s[4];
  uVar24 = s[0x14];
  uVar5 = uVar6 ^ uVar24 ^ s[0xc];
  uVar17 = (uVar5 << 0x15 | uVar5 >> 0x2b) ^ s[0xc];
  uVar6 = (uVar6 << 8 | uVar6 >> 0x38) ^ uVar17;
  uVar24 = (uVar24 << 0xe | uVar24 >> 0x32) ^ uVar24 ^ (uVar17 << 0x21 | uVar17 >> 0x1f);
  s[4] = (~uVar24 | uVar6) ^ uVar5;
  s[0xc] = (uVar24 | uVar5) ^ uVar6;
  s[0x14] = uVar6 & uVar5 ^ uVar24;
  uVar6 = s[5];
  uVar24 = s[0x15];
  uVar5 = uVar6 ^ uVar24 ^ s[0xd];
  uVar17 = (uVar5 << 0x13 | uVar5 >> 0x2d) ^ s[0xd];
  uVar6 = (uVar6 << 0x38 | uVar6 >> 8) ^ uVar17;
  uVar24 = (uVar24 << 0x22 | uVar24 >> 0x1e) ^ uVar24 ^ (uVar17 << 0x27 | uVar17 >> 0x19);
  s[5] = (~uVar24 | uVar6) ^ uVar5;
  s[0xd] = (uVar24 | uVar5) ^ uVar6;
  s[0x15] = uVar6 & uVar5 ^ uVar24;
  uVar6 = s[6];
  uVar24 = s[0x16];
  uVar5 = uVar6 ^ uVar24 ^ s[0xe];
  uVar3 = (uVar5 << 5 | uVar5 >> 0x3b) ^ s[0xe];
  uVar17 = (uVar6 << 8 | uVar6 >> 0x38) ^ uVar3;
  uVar21 = (uVar24 << 0x2e | uVar24 >> 0x12) ^ uVar24 ^ (uVar3 << 0x11 | uVar3 >> 0x2f);
  s[0xe] = (uVar21 | uVar5) ^ uVar17;
  s[0x16] = uVar17 & uVar5 ^ uVar21;
  uVar6 = s[7];
  uVar24 = s[0x17];
  uVar3 = uVar6 ^ uVar24 ^ s[0xf];
  uVar22 = (uVar3 << 0x23 | uVar3 >> 0x1d) ^ s[0xf];
  uVar19 = (uVar6 << 0x38 | uVar6 >> 8) ^ uVar22;
  uVar5 = (~uVar21 | uVar17) ^ uVar5;
  uVar24 = (uVar24 << 2 | uVar24 >> 0x3e) ^ uVar24 ^ (uVar22 << 0x37 | uVar22 >> 9);
  s[7] = (~uVar24 | uVar19) ^ uVar3;
  uVar6 = (uVar24 | uVar3) ^ uVar19;
  s[0x17] = uVar19 & uVar3 ^ uVar24;
  s[1] = s[1] ^ 0x6c770cb40eb34982;
  uVar24 = uVar6 ^ s[0x11] ^ uVar5;
  uVar17 = (uVar24 << 0x35 | uVar24 >> 0xb) ^ s[0x11];
  uVar6 = (uVar6 << 8 | uVar6 >> 0x38) ^ uVar17;
  uVar5 = (uVar5 << 0xe | uVar5 >> 0x32) ^ uVar5 ^ (uVar17 << 1 | (ulong)((long)uVar17 < 0));
  s[0xf] = (~uVar5 | uVar6) ^ uVar24;
  s[0x11] = (uVar5 | uVar24) ^ uVar6;
  s[6] = uVar6 & uVar24 ^ uVar5;
  uVar6 = s[10];
  uVar24 = s[3];
  uVar5 = uVar6 ^ uVar24 ^ s[0x10];
  uVar17 = (uVar5 << 0x33 | uVar5 >> 0xd) ^ s[0x10];
  uVar6 = (uVar6 << 0x38 | uVar6 >> 8) ^ uVar17;
  uVar24 = (uVar24 << 0x22 | uVar24 >> 0x1e) ^ uVar24 ^ (uVar17 << 7 | uVar17 >> 0x39);
  s[10] = (~uVar24 | uVar6) ^ uVar5;
  s[0x10] = (uVar24 | uVar5) ^ uVar6;
  s[3] = uVar6 & uVar5 ^ uVar24;
  uVar6 = *s;
  uVar24 = s[9];
  uVar5 = uVar24 ^ uVar6 ^ s[0x13];
  uVar17 = (uVar5 << 0x25 | uVar5 >> 0x1b) ^ s[0x13];
  uVar24 = (uVar24 << 8 | uVar24 >> 0x38) ^ uVar17;
  uVar6 = (uVar6 << 0x2e | uVar6 >> 0x12) ^ uVar6 ^ (uVar17 << 0x31 | uVar17 >> 0xf);
  s[9] = (~uVar6 | uVar24) ^ uVar5;
  s[0x13] = (uVar6 | uVar5) ^ uVar24;
  *s = uVar24 & uVar5 ^ uVar6;
  uVar6 = s[0xc];
  uVar24 = s[5];
  uVar5 = uVar6 ^ uVar24 ^ s[0x12];
  uVar17 = (uVar5 << 3 | uVar5 >> 0x3d) ^ s[0x12];
  uVar6 = (uVar6 << 0x38 | uVar6 >> 8) ^ uVar17;
  uVar24 = (uVar24 << 2 | uVar24 >> 0x3e) ^ uVar24 ^ (uVar17 << 0x17 | uVar17 >> 0x29);
  s[0xc] = (~uVar24 | uVar6) ^ uVar5;
  s[0x12] = (uVar24 | uVar5) ^ uVar6;
  s[5] = uVar6 & uVar5 ^ uVar24;
  uVar6 = s[2];
  uVar24 = s[0xb];
  uVar5 = uVar24 ^ uVar6 ^ s[0x15];
  uVar17 = (uVar5 << 0x15 | uVar5 >> 0x2b) ^ s[0x15];
  uVar24 = (uVar24 << 8 | uVar24 >> 0x38) ^ uVar17;
  uVar6 = (uVar6 << 0xe | uVar6 >> 0x32) ^ uVar6 ^ (uVar17 << 0x21 | uVar17 >> 0x1f);
  s[0xb] = (~uVar6 | uVar24) ^ uVar5;
  s[0x15] = (uVar6 | uVar5) ^ uVar24;
  s[2] = uVar24 & uVar5 ^ uVar6;
  uVar6 = s[0xe];
  uVar24 = s[7];
  uVar5 = uVar6 ^ uVar24 ^ s[0x14];
  uVar17 = (uVar5 << 0x13 | uVar5 >> 0x2d) ^ s[0x14];
  uVar6 = (uVar6 << 0x38 | uVar6 >> 8) ^ uVar17;
  uVar24 = (uVar24 << 0x22 | uVar24 >> 0x1e) ^ uVar24 ^ (uVar17 << 0x27 | uVar17 >> 0x19);
  s[0xe] = (~uVar24 | uVar6) ^ uVar5;
  s[0x14] = (uVar24 | uVar5) ^ uVar6;
  s[7] = uVar6 & uVar5 ^ uVar24;
  uVar6 = s[4];
  uVar24 = s[0xd];
  uVar5 = uVar24 ^ uVar6 ^ s[0x17];
  uVar3 = (uVar5 << 5 | uVar5 >> 0x3b) ^ s[0x17];
  uVar17 = (uVar24 << 8 | uVar24 >> 0x38) ^ uVar3;
  uVar3 = (uVar6 << 0x2e | uVar6 >> 0x12) ^ uVar6 ^ (uVar3 << 0x11 | uVar3 >> 0x2f);
  s[0x17] = (uVar3 | uVar5) ^ uVar17;
  s[4] = uVar17 & uVar5 ^ uVar3;
  uVar6 = s[1];
  uVar24 = s[8];
  uVar21 = uVar24 ^ uVar6 ^ s[0x16];
  uVar22 = (uVar21 << 0x23 | uVar21 >> 0x1d) ^ s[0x16];
  uVar19 = (uVar24 << 0x38 | uVar24 >> 8) ^ uVar22;
  uVar5 = (~uVar3 | uVar17) ^ uVar5;
  uVar24 = (uVar6 << 2 | uVar6 >> 0x3e) ^ uVar6 ^ (uVar22 << 0x37 | uVar22 >> 9);
  s[8] = (~uVar24 | uVar19) ^ uVar21;
  uVar6 = (uVar24 | uVar21) ^ uVar19;
  s[1] = uVar19 & uVar21 ^ uVar24;
  s[10] = s[10] ^ 0x363b865a0759a4c1;
  uVar24 = uVar6 ^ s[3] ^ uVar5;
  uVar17 = (uVar24 << 0x35 | uVar24 >> 0xb) ^ s[3];
  uVar6 = (uVar6 << 8 | uVar6 >> 0x38) ^ uVar17;
  uVar5 = (uVar5 << 0xe | uVar5 >> 0x32) ^ uVar5 ^ (uVar17 << 1 | (ulong)((long)uVar17 < 0));
  s[0x16] = (~uVar5 | uVar6) ^ uVar24;
  s[3] = (uVar5 | uVar24) ^ uVar6;
  s[0xd] = uVar6 & uVar24 ^ uVar5;
  uVar6 = s[0x13];
  uVar24 = s[0xc];
  uVar5 = uVar6 ^ uVar24 ^ s[6];
  uVar17 = (uVar5 << 0x33 | uVar5 >> 0xd) ^ s[6];
  uVar6 = (uVar6 << 0x38 | uVar6 >> 8) ^ uVar17;
  uVar24 = (uVar24 << 0x22 | uVar24 >> 0x1e) ^ uVar24 ^ (uVar17 << 7 | uVar17 >> 0x39);
  s[0x13] = (~uVar24 | uVar6) ^ uVar5;
  s[6] = (uVar24 | uVar5) ^ uVar6;
  s[0xc] = uVar6 & uVar5 ^ uVar24;
  uVar6 = s[0x10];
  uVar24 = s[0xf];
  uVar5 = uVar6 ^ uVar24 ^ s[5];
  uVar17 = (uVar5 << 0x25 | uVar5 >> 0x1b) ^ s[5];
  uVar6 = (uVar6 << 8 | uVar6 >> 0x38) ^ uVar17;
  uVar24 = (uVar24 << 0x2e | uVar24 >> 0x12) ^ uVar24 ^ (uVar17 << 0x31 | uVar17 >> 0xf);
  s[0x10] = (~uVar24 | uVar6) ^ uVar5;
  s[5] = (uVar24 | uVar5) ^ uVar6;
  s[0xf] = uVar6 & uVar5 ^ uVar24;
  uVar6 = s[0x15];
  uVar24 = s[0xe];
  uVar5 = uVar6 ^ uVar24 ^ *s;
  uVar17 = (uVar5 << 3 | uVar5 >> 0x3d) ^ *s;
  uVar6 = (uVar6 << 0x38 | uVar6 >> 8) ^ uVar17;
  uVar24 = (uVar24 << 2 | uVar24 >> 0x3e) ^ uVar24 ^ (uVar17 << 0x17 | uVar17 >> 0x29);
  s[0x15] = (~uVar24 | uVar6) ^ uVar5;
  *s = (uVar24 | uVar5) ^ uVar6;
  s[0xe] = uVar6 & uVar5 ^ uVar24;
  uVar6 = s[0x12];
  uVar24 = s[9];
  uVar5 = uVar6 ^ uVar24 ^ s[7];
  uVar17 = (uVar5 << 0x15 | uVar5 >> 0x2b) ^ s[7];
  uVar6 = (uVar6 << 8 | uVar6 >> 0x38) ^ uVar17;
  uVar24 = (uVar24 << 0xe | uVar24 >> 0x32) ^ uVar24 ^ (uVar17 << 0x21 | uVar17 >> 0x1f);
  s[0x12] = (~uVar24 | uVar6) ^ uVar5;
  s[7] = (uVar24 | uVar5) ^ uVar6;
  s[9] = uVar6 & uVar5 ^ uVar24;
  uVar6 = s[0x17];
  uVar24 = s[8];
  uVar5 = uVar6 ^ uVar24 ^ s[2];
  uVar17 = (uVar5 << 0x13 | uVar5 >> 0x2d) ^ s[2];
  uVar6 = (uVar6 << 0x38 | uVar6 >> 8) ^ uVar17;
  uVar24 = (uVar24 << 0x22 | uVar24 >> 0x1e) ^ uVar24 ^ (uVar17 << 0x27 | uVar17 >> 0x19);
  s[0x17] = (~uVar24 | uVar6) ^ uVar5;
  s[2] = (uVar24 | uVar5) ^ uVar6;
  s[8] = uVar6 & uVar5 ^ uVar24;
  uVar6 = s[0x14];
  uVar24 = s[0xb];
  uVar5 = uVar6 ^ uVar24 ^ s[1];
  uVar3 = (uVar5 << 5 | uVar5 >> 0x3b) ^ s[1];
  uVar17 = (uVar6 << 8 | uVar6 >> 0x38) ^ uVar3;
  uVar21 = (uVar24 << 0x2e | uVar24 >> 0x12) ^ uVar24 ^ (uVar3 << 0x11 | uVar3 >> 0x2f);
  s[1] = (uVar21 | uVar5) ^ uVar17;
  s[0xb] = uVar17 & uVar5 ^ uVar21;
  uVar6 = s[0x11];
  uVar24 = s[10];
  uVar19 = uVar6 ^ uVar24 ^ s[4];
  uVar22 = (uVar19 << 0x23 | uVar19 >> 0x1d) ^ s[4];
  uVar3 = (uVar6 << 0x38 | uVar6 >> 8) ^ uVar22;
  uVar5 = (~uVar21 | uVar17) ^ uVar5;
  uVar24 = (uVar24 << 2 | uVar24 >> 0x3e) ^ uVar24 ^ (uVar22 << 0x37 | uVar22 >> 9);
  s[0x11] = (~uVar24 | uVar3) ^ uVar19;
  uVar6 = (uVar24 | uVar19) ^ uVar3;
  s[10] = uVar3 & uVar19 ^ uVar24;
  s[0x13] = s[0x13] ^ 0xc73622b47c4c0ace;
  uVar24 = uVar6 ^ s[0xc] ^ uVar5;
  uVar17 = (uVar24 << 0x35 | uVar24 >> 0xb) ^ s[0xc];
  uVar6 = (uVar6 << 8 | uVar6 >> 0x38) ^ uVar17;
  uVar5 = (uVar5 << 0xe | uVar5 >> 0x32) ^ uVar5 ^ (uVar17 << 1 | (ulong)((long)uVar17 < 0));
  s[4] = (~uVar5 | uVar6) ^ uVar24;
  s[0xc] = (uVar5 | uVar24) ^ uVar6;
  s[0x14] = uVar6 & uVar24 ^ uVar5;
  uVar6 = s[5];
  uVar24 = s[0x15];
  uVar5 = uVar6 ^ uVar24 ^ s[0xd];
  uVar17 = (uVar5 << 0x33 | uVar5 >> 0xd) ^ s[0xd];
  uVar6 = (uVar6 << 0x38 | uVar6 >> 8) ^ uVar17;
  uVar24 = (uVar24 << 0x22 | uVar24 >> 0x1e) ^ uVar24 ^ (uVar17 << 7 | uVar17 >> 0x39);
  s[5] = (~uVar24 | uVar6) ^ uVar5;
  s[0xd] = (uVar24 | uVar5) ^ uVar6;
  s[0x15] = uVar6 & uVar5 ^ uVar24;
  uVar6 = s[6];
  uVar24 = s[0x16];
  uVar5 = uVar6 ^ uVar24 ^ s[0xe];
  uVar17 = (uVar5 << 0x25 | uVar5 >> 0x1b) ^ s[0xe];
  uVar6 = (uVar6 << 8 | uVar6 >> 0x38) ^ uVar17;
  uVar24 = (uVar24 << 0x2e | uVar24 >> 0x12) ^ uVar24 ^ (uVar17 << 0x31 | uVar17 >> 0xf);
  s[6] = (~uVar24 | uVar6) ^ uVar5;
  s[0xe] = (uVar24 | uVar5) ^ uVar6;
  s[0x16] = uVar6 & uVar5 ^ uVar24;
  uVar6 = s[7];
  uVar24 = s[0x17];
  uVar5 = uVar6 ^ uVar24 ^ s[0xf];
  uVar17 = (uVar5 << 3 | uVar5 >> 0x3d) ^ s[0xf];
  uVar6 = (uVar6 << 0x38 | uVar6 >> 8) ^ uVar17;
  uVar24 = (uVar24 << 2 | uVar24 >> 0x3e) ^ uVar24 ^ (uVar17 << 0x17 | uVar17 >> 0x29);
  s[7] = (~uVar24 | uVar6) ^ uVar5;
  s[0xf] = (uVar24 | uVar5) ^ uVar6;
  s[0x17] = uVar6 & uVar5 ^ uVar24;
  uVar6 = *s;
  uVar24 = s[0x10];
  uVar5 = uVar6 ^ uVar24 ^ s[8];
  uVar17 = (uVar5 << 0x15 | uVar5 >> 0x2b) ^ s[8];
  uVar6 = (uVar6 << 8 | uVar6 >> 0x38) ^ uVar17;
  uVar24 = (uVar24 << 0xe | uVar24 >> 0x32) ^ uVar24 ^ (uVar17 << 0x21 | uVar17 >> 0x1f);
  *s = (~uVar24 | uVar6) ^ uVar5;
  s[8] = (uVar24 | uVar5) ^ uVar6;
  s[0x10] = uVar6 & uVar5 ^ uVar24;
  uVar6 = s[1];
  uVar24 = s[0x11];
  uVar5 = uVar6 ^ uVar24 ^ s[9];
  uVar17 = (uVar5 << 0x13 | uVar5 >> 0x2d) ^ s[9];
  uVar6 = (uVar6 << 0x38 | uVar6 >> 8) ^ uVar17;
  uVar24 = (uVar24 << 0x22 | uVar24 >> 0x1e) ^ uVar24 ^ (uVar17 << 0x27 | uVar17 >> 0x19);
  s[1] = (~uVar24 | uVar6) ^ uVar5;
  s[9] = (uVar24 | uVar5) ^ uVar6;
  s[0x11] = uVar6 & uVar5 ^ uVar24;
  uVar6 = s[2];
  uVar24 = s[0x12];
  uVar5 = uVar6 ^ uVar24 ^ s[10];
  uVar3 = (uVar5 << 5 | uVar5 >> 0x3b) ^ s[10];
  uVar17 = (uVar6 << 8 | uVar6 >> 0x38) ^ uVar3;
  uVar21 = (uVar24 << 0x2e | uVar24 >> 0x12) ^ uVar24 ^ (uVar3 << 0x11 | uVar3 >> 0x2f);
  s[10] = (uVar21 | uVar5) ^ uVar17;
  s[0x12] = uVar17 & uVar5 ^ uVar21;
  uVar6 = s[3];
  uVar24 = s[0x13];
  uVar3 = uVar6 ^ uVar24 ^ s[0xb];
  uVar22 = (uVar3 << 0x23 | uVar3 >> 0x1d) ^ s[0xb];
  uVar19 = (uVar6 << 0x38 | uVar6 >> 8) ^ uVar22;
  uVar5 = (~uVar21 | uVar17) ^ uVar5;
  uVar24 = (uVar24 << 2 | uVar24 >> 0x3e) ^ uVar24 ^ (uVar22 << 0x37 | uVar22 >> 9);
  s[3] = (~uVar24 | uVar19) ^ uVar3;
  uVar6 = (uVar24 | uVar3) ^ uVar19;
  s[0x13] = uVar19 & uVar3 ^ uVar24;
  s[5] = s[5] ^ 0x639b115a3e260567;
  uVar24 = uVar6 ^ s[0x15] ^ uVar5;
  uVar17 = (uVar24 << 0x35 | uVar24 >> 0xb) ^ s[0x15];
  uVar6 = (uVar6 << 8 | uVar6 >> 0x38) ^ uVar17;
  uVar5 = (uVar5 << 0xe | uVar5 >> 0x32) ^ uVar5 ^ (uVar17 << 1 | (ulong)((long)uVar17 < 0));
  s[0xb] = (~uVar5 | uVar6) ^ uVar24;
  s[0x15] = (uVar5 | uVar24) ^ uVar6;
  s[2] = uVar6 & uVar24 ^ uVar5;
  uVar6 = s[0xe];
  uVar24 = s[7];
  uVar5 = uVar6 ^ uVar24 ^ s[0x14];
  uVar17 = (uVar5 << 0x33 | uVar5 >> 0xd) ^ s[0x14];
  uVar6 = (uVar6 << 0x38 | uVar6 >> 8) ^ uVar17;
  uVar24 = (uVar24 << 0x22 | uVar24 >> 0x1e) ^ uVar24 ^ (uVar17 << 7 | uVar17 >> 0x39);
  s[0xe] = (~uVar24 | uVar6) ^ uVar5;
  s[0x14] = (uVar24 | uVar5) ^ uVar6;
  s[7] = uVar6 & uVar5 ^ uVar24;
  uVar6 = s[4];
  uVar24 = s[0xd];
  uVar5 = uVar24 ^ uVar6 ^ s[0x17];
  uVar17 = (uVar5 << 0x25 | uVar5 >> 0x1b) ^ s[0x17];
  uVar24 = (uVar24 << 8 | uVar24 >> 0x38) ^ uVar17;
  uVar6 = (uVar6 << 0x2e | uVar6 >> 0x12) ^ uVar6 ^ (uVar17 << 0x31 | uVar17 >> 0xf);
  s[0xd] = (~uVar6 | uVar24) ^ uVar5;
  s[0x17] = (uVar6 | uVar5) ^ uVar24;
  s[4] = uVar24 & uVar5 ^ uVar6;
  uVar6 = s[8];
  uVar24 = s[1];
  uVar5 = uVar6 ^ uVar24 ^ s[0x16];
  uVar17 = (uVar5 << 3 | uVar5 >> 0x3d) ^ s[0x16];
  uVar6 = (uVar6 << 0x38 | uVar6 >> 8) ^ uVar17;
  uVar24 = (uVar24 << 2 | uVar24 >> 0x3e) ^ uVar24 ^ (uVar17 << 0x17 | uVar17 >> 0x29);
  s[8] = (~uVar24 | uVar6) ^ uVar5;
  s[0x16] = (uVar24 | uVar5) ^ uVar6;
  s[1] = uVar6 & uVar5 ^ uVar24;
  uVar6 = s[6];
  uVar24 = s[0xf];
  uVar5 = uVar24 ^ uVar6 ^ s[0x11];
  uVar17 = (uVar5 << 0x15 | uVar5 >> 0x2b) ^ s[0x11];
  uVar24 = (uVar24 << 8 | uVar24 >> 0x38) ^ uVar17;
  uVar6 = (uVar6 << 0xe | uVar6 >> 0x32) ^ uVar6 ^ (uVar17 << 0x21 | uVar17 >> 0x1f);
  s[0xf] = (~uVar6 | uVar24) ^ uVar5;
  s[0x11] = (uVar6 | uVar5) ^ uVar24;
  s[6] = uVar24 & uVar5 ^ uVar6;
  uVar6 = s[10];
  uVar24 = s[3];
  uVar5 = uVar6 ^ uVar24 ^ s[0x10];
  uVar17 = (uVar5 << 0x13 | uVar5 >> 0x2d) ^ s[0x10];
  uVar6 = (uVar6 << 0x38 | uVar6 >> 8) ^ uVar17;
  uVar24 = (uVar24 << 0x22 | uVar24 >> 0x1e) ^ uVar24 ^ (uVar17 << 0x27 | uVar17 >> 0x19);
  s[10] = (~uVar24 | uVar6) ^ uVar5;
  s[0x10] = (uVar24 | uVar5) ^ uVar6;
  s[3] = uVar6 & uVar5 ^ uVar24;
  uVar6 = *s;
  uVar24 = s[9];
  uVar5 = uVar24 ^ uVar6 ^ s[0x13];
  uVar3 = (uVar5 << 5 | uVar5 >> 0x3b) ^ s[0x13];
  uVar17 = (uVar24 << 8 | uVar24 >> 0x38) ^ uVar3;
  uVar3 = (uVar6 << 0x2e | uVar6 >> 0x12) ^ uVar6 ^ (uVar3 << 0x11 | uVar3 >> 0x2f);
  s[0x13] = (uVar3 | uVar5) ^ uVar17;
  *s = uVar17 & uVar5 ^ uVar3;
  uVar6 = s[5];
  uVar24 = s[0xc];
  uVar21 = uVar24 ^ uVar6 ^ s[0x12];
  uVar22 = (uVar21 << 0x23 | uVar21 >> 0x1d) ^ s[0x12];
  uVar19 = (uVar24 << 0x38 | uVar24 >> 8) ^ uVar22;
  uVar5 = (~uVar3 | uVar17) ^ uVar5;
  uVar24 = (uVar6 << 2 | uVar6 >> 0x3e) ^ uVar6 ^ (uVar22 << 0x37 | uVar22 >> 9);
  s[0xc] = (~uVar24 | uVar19) ^ uVar21;
  uVar6 = (uVar24 | uVar21) ^ uVar19;
  s[5] = uVar19 & uVar21 ^ uVar24;
  s[0xe] = s[0xe] ^ 0xede6693460f3da1d;
  uVar24 = uVar6 ^ s[7] ^ uVar5;
  uVar17 = (uVar24 << 0x35 | uVar24 >> 0xb) ^ s[7];
  uVar6 = (uVar6 << 8 | uVar6 >> 0x38) ^ uVar17;
  uVar5 = (uVar5 << 0xe | uVar5 >> 0x32) ^ uVar5 ^ (uVar17 << 1 | (ulong)((long)uVar17 < 0));
  s[0x12] = (~uVar5 | uVar6) ^ uVar24;
  s[7] = (uVar5 | uVar24) ^ uVar6;
  s[9] = uVar6 & uVar24 ^ uVar5;
  uVar6 = s[0x17];
  uVar24 = s[8];
  uVar5 = uVar6 ^ uVar24 ^ s[2];
  uVar17 = (uVar5 << 0x33 | uVar5 >> 0xd) ^ s[2];
  uVar6 = (uVar6 << 0x38 | uVar6 >> 8) ^ uVar17;
  uVar24 = (uVar24 << 0x22 | uVar24 >> 0x1e) ^ uVar24 ^ (uVar17 << 7 | uVar17 >> 0x39);
  s[0x17] = (~uVar24 | uVar6) ^ uVar5;
  s[2] = (uVar24 | uVar5) ^ uVar6;
  s[8] = uVar6 & uVar5 ^ uVar24;
  uVar6 = s[0x14];
  uVar24 = s[0xb];
  uVar5 = uVar6 ^ uVar24 ^ s[1];
  uVar17 = (uVar5 << 0x25 | uVar5 >> 0x1b) ^ s[1];
  uVar6 = (uVar6 << 8 | uVar6 >> 0x38) ^ uVar17;
  uVar24 = (uVar24 << 0x2e | uVar24 >> 0x12) ^ uVar24 ^ (uVar17 << 0x31 | uVar17 >> 0xf);
  s[0x14] = (~uVar24 | uVar6) ^ uVar5;
  s[1] = (uVar24 | uVar5) ^ uVar6;
  s[0xb] = uVar6 & uVar5 ^ uVar24;
  uVar6 = s[0x11];
  uVar24 = s[10];
  uVar5 = uVar6 ^ uVar24 ^ s[4];
  uVar17 = (uVar5 << 3 | uVar5 >> 0x3d) ^ s[4];
  uVar6 = (uVar6 << 0x38 | uVar6 >> 8) ^ uVar17;
  uVar24 = (uVar24 << 2 | uVar24 >> 0x3e) ^ uVar24 ^ (uVar17 << 0x17 | uVar17 >> 0x29);
  s[0x11] = (~uVar24 | uVar6) ^ uVar5;
  s[4] = (uVar24 | uVar5) ^ uVar6;
  s[10] = uVar6 & uVar5 ^ uVar24;
  uVar6 = s[0x16];
  uVar24 = s[0xd];
  uVar5 = uVar6 ^ uVar24 ^ s[3];
  uVar17 = (uVar5 << 0x15 | uVar5 >> 0x2b) ^ s[3];
  uVar6 = (uVar6 << 8 | uVar6 >> 0x38) ^ uVar17;
  uVar24 = (uVar24 << 0xe | uVar24 >> 0x32) ^ uVar24 ^ (uVar17 << 0x21 | uVar17 >> 0x1f);
  s[0x16] = (~uVar24 | uVar6) ^ uVar5;
  s[3] = (uVar24 | uVar5) ^ uVar6;
  s[0xd] = uVar6 & uVar5 ^ uVar24;
  uVar6 = s[0x13];
  uVar24 = s[0xc];
  uVar5 = uVar6 ^ uVar24 ^ s[6];
  uVar17 = (uVar5 << 0x13 | uVar5 >> 0x2d) ^ s[6];
  uVar6 = (uVar6 << 0x38 | uVar6 >> 8) ^ uVar17;
  uVar24 = (uVar24 << 0x22 | uVar24 >> 0x1e) ^ uVar24 ^ (uVar17 << 0x27 | uVar17 >> 0x19);
  s[0x13] = (~uVar24 | uVar6) ^ uVar5;
  s[6] = (uVar24 | uVar5) ^ uVar6;
  s[0xc] = uVar6 & uVar5 ^ uVar24;
  uVar6 = s[0x10];
  uVar24 = s[0xf];
  uVar5 = uVar6 ^ uVar24 ^ s[5];
  uVar3 = (uVar5 << 5 | uVar5 >> 0x3b) ^ s[5];
  uVar17 = (uVar6 << 8 | uVar6 >> 0x38) ^ uVar3;
  uVar21 = (uVar24 << 0x2e | uVar24 >> 0x12) ^ uVar24 ^ (uVar3 << 0x11 | uVar3 >> 0x2f);
  s[5] = (uVar21 | uVar5) ^ uVar17;
  s[0xf] = uVar17 & uVar5 ^ uVar21;
  uVar6 = s[0x15];
  uVar24 = s[0xe];
  uVar19 = uVar6 ^ uVar24 ^ *s;
  uVar22 = (uVar19 << 0x23 | uVar19 >> 0x1d) ^ *s;
  uVar3 = (uVar6 << 0x38 | uVar6 >> 8) ^ uVar22;
  uVar5 = (~uVar21 | uVar17) ^ uVar5;
  uVar24 = (uVar24 << 2 | uVar24 >> 0x3e) ^ uVar24 ^ (uVar22 << 0x37 | uVar22 >> 9);
  s[0x15] = (~uVar24 | uVar3) ^ uVar19;
  uVar6 = (uVar24 | uVar19) ^ uVar3;
  s[0xe] = uVar3 & uVar19 ^ uVar24;
  s[0x17] = s[0x17] ^ 0xaad8d5034f9935a0;
  uVar24 = uVar6 ^ s[8] ^ uVar5;
  uVar17 = (uVar24 << 0x35 | uVar24 >> 0xb) ^ s[8];
  uVar6 = (uVar6 << 8 | uVar6 >> 0x38) ^ uVar17;
  uVar5 = (uVar5 << 0xe | uVar5 >> 0x32) ^ uVar5 ^ (uVar17 << 1 | (ulong)((long)uVar17 < 0));
  *s = (~uVar5 | uVar6) ^ uVar24;
  s[8] = (uVar5 | uVar24) ^ uVar6;
  s[0x10] = uVar6 & uVar24 ^ uVar5;
  uVar6 = s[1];
  uVar24 = s[0x11];
  uVar5 = uVar6 ^ uVar24 ^ s[9];
  uVar17 = (uVar5 << 0x33 | uVar5 >> 0xd) ^ s[9];
  uVar6 = (uVar6 << 0x38 | uVar6 >> 8) ^ uVar17;
  uVar24 = (uVar24 << 0x22 | uVar24 >> 0x1e) ^ uVar24 ^ (uVar17 << 7 | uVar17 >> 0x39);
  s[1] = (~uVar24 | uVar6) ^ uVar5;
  s[9] = (uVar24 | uVar5) ^ uVar6;
  s[0x11] = uVar6 & uVar5 ^ uVar24;
  uVar6 = s[2];
  uVar24 = s[0x12];
  uVar5 = uVar6 ^ uVar24 ^ s[10];
  uVar17 = (uVar5 << 0x25 | uVar5 >> 0x1b) ^ s[10];
  uVar6 = (uVar6 << 8 | uVar6 >> 0x38) ^ uVar17;
  uVar24 = (uVar24 << 0x2e | uVar24 >> 0x12) ^ uVar24 ^ (uVar17 << 0x31 | uVar17 >> 0xf);
  s[2] = (~uVar24 | uVar6) ^ uVar5;
  s[10] = (uVar24 | uVar5) ^ uVar6;
  s[0x12] = uVar6 & uVar5 ^ uVar24;
  uVar6 = s[3];
  uVar24 = s[0x13];
  uVar5 = uVar6 ^ uVar24 ^ s[0xb];
  uVar17 = (uVar5 << 3 | uVar5 >> 0x3d) ^ s[0xb];
  uVar6 = (uVar6 << 0x38 | uVar6 >> 8) ^ uVar17;
  uVar24 = (uVar24 << 2 | uVar24 >> 0x3e) ^ uVar24 ^ (uVar17 << 0x17 | uVar17 >> 0x29);
  s[3] = (~uVar24 | uVar6) ^ uVar5;
  s[0xb] = (uVar24 | uVar5) ^ uVar6;
  s[0x13] = uVar6 & uVar5 ^ uVar24;
  uVar6 = s[4];
  uVar24 = s[0x14];
  uVar5 = uVar6 ^ uVar24 ^ s[0xc];
  uVar17 = (uVar5 << 0x15 | uVar5 >> 0x2b) ^ s[0xc];
  uVar6 = (uVar6 << 8 | uVar6 >> 0x38) ^ uVar17;
  uVar24 = (uVar24 << 0xe | uVar24 >> 0x32) ^ uVar24 ^ (uVar17 << 0x21 | uVar17 >> 0x1f);
  s[4] = (~uVar24 | uVar6) ^ uVar5;
  s[0xc] = (uVar24 | uVar5) ^ uVar6;
  s[0x14] = uVar6 & uVar5 ^ uVar24;
  uVar6 = s[5];
  uVar24 = s[0x15];
  uVar5 = uVar6 ^ uVar24 ^ s[0xd];
  uVar17 = (uVar5 << 0x13 | uVar5 >> 0x2d) ^ s[0xd];
  uVar6 = (uVar6 << 0x38 | uVar6 >> 8) ^ uVar17;
  uVar24 = (uVar24 << 0x22 | uVar24 >> 0x1e) ^ uVar24 ^ (uVar17 << 0x27 | uVar17 >> 0x19);
  s[5] = (~uVar24 | uVar6) ^ uVar5;
  s[0xd] = (uVar24 | uVar5) ^ uVar6;
  s[0x15] = uVar6 & uVar5 ^ uVar24;
  uVar6 = s[6];
  uVar24 = s[0x16];
  uVar5 = uVar6 ^ uVar24 ^ s[0xe];
  uVar3 = (uVar5 << 5 | uVar5 >> 0x3b) ^ s[0xe];
  uVar17 = (uVar6 << 8 | uVar6 >> 0x38) ^ uVar3;
  uVar21 = (uVar24 << 0x2e | uVar24 >> 0x12) ^ uVar24 ^ (uVar3 << 0x11 | uVar3 >> 0x2f);
  s[0xe] = (uVar21 | uVar5) ^ uVar17;
  s[0x16] = uVar17 & uVar5 ^ uVar21;
  uVar6 = s[7];
  uVar24 = s[0x17];
  uVar3 = uVar6 ^ uVar24 ^ s[0xf];
  uVar22 = (uVar3 << 0x23 | uVar3 >> 0x1d) ^ s[0xf];
  uVar19 = (uVar6 << 0x38 | uVar6 >> 8) ^ uVar22;
  uVar5 = (~uVar21 | uVar17) ^ uVar5;
  uVar24 = (uVar24 << 2 | uVar24 >> 0x3e) ^ uVar24 ^ (uVar22 << 0x37 | uVar22 >> 9);
  s[7] = (~uVar24 | uVar19) ^ uVar3;
  uVar6 = (uVar24 | uVar3) ^ uVar19;
  s[0x17] = uVar19 & uVar3 ^ uVar24;
  s[1] = s[1] ^ 0x556c6a81a7cc9ad0;
  uVar24 = uVar6 ^ s[0x11] ^ uVar5;
  uVar17 = (uVar24 << 0x35 | uVar24 >> 0xb) ^ s[0x11];
  uVar6 = (uVar6 << 8 | uVar6 >> 0x38) ^ uVar17;
  uVar5 = (uVar5 << 0xe | uVar5 >> 0x32) ^ uVar5 ^ (uVar17 << 1 | (ulong)((long)uVar17 < 0));
  s[0xf] = (~uVar5 | uVar6) ^ uVar24;
  s[0x11] = (uVar5 | uVar24) ^ uVar6;
  s[6] = uVar6 & uVar24 ^ uVar5;
  uVar6 = s[10];
  uVar24 = s[3];
  uVar5 = uVar6 ^ uVar24 ^ s[0x10];
  uVar17 = (uVar5 << 0x33 | uVar5 >> 0xd) ^ s[0x10];
  uVar6 = (uVar6 << 0x38 | uVar6 >> 8) ^ uVar17;
  uVar24 = (uVar24 << 0x22 | uVar24 >> 0x1e) ^ uVar24 ^ (uVar17 << 7 | uVar17 >> 0x39);
  s[10] = (~uVar24 | uVar6) ^ uVar5;
  s[0x10] = (uVar24 | uVar5) ^ uVar6;
  s[3] = uVar6 & uVar5 ^ uVar24;
  uVar6 = *s;
  uVar24 = s[9];
  uVar5 = uVar24 ^ uVar6 ^ s[0x13];
  uVar17 = (uVar5 << 0x25 | uVar5 >> 0x1b) ^ s[0x13];
  uVar24 = (uVar24 << 8 | uVar24 >> 0x38) ^ uVar17;
  uVar6 = (uVar6 << 0x2e | uVar6 >> 0x12) ^ uVar6 ^ (uVar17 << 0x31 | uVar17 >> 0xf);
  s[9] = (~uVar6 | uVar24) ^ uVar5;
  s[0x13] = (uVar6 | uVar5) ^ uVar24;
  *s = uVar24 & uVar5 ^ uVar6;
  uVar6 = s[0xc];
  uVar24 = s[5];
  uVar5 = uVar6 ^ uVar24 ^ s[0x12];
  uVar17 = (uVar5 << 3 | uVar5 >> 0x3d) ^ s[0x12];
  uVar6 = (uVar6 << 0x38 | uVar6 >> 8) ^ uVar17;
  uVar24 = (uVar24 << 2 | uVar24 >> 0x3e) ^ uVar24 ^ (uVar17 << 0x17 | uVar17 >> 0x29);
  s[0xc] = (~uVar24 | uVar6) ^ uVar5;
  s[0x12] = (uVar24 | uVar5) ^ uVar6;
  s[5] = uVar6 & uVar5 ^ uVar24;
  uVar6 = s[2];
  uVar24 = s[0xb];
  uVar5 = uVar24 ^ uVar6 ^ s[0x15];
  uVar17 = (uVar5 << 0x15 | uVar5 >> 0x2b) ^ s[0x15];
  uVar24 = (uVar24 << 8 | uVar24 >> 0x38) ^ uVar17;
  uVar6 = (uVar6 << 0xe | uVar6 >> 0x32) ^ uVar6 ^ (uVar17 << 0x21 | uVar17 >> 0x1f);
  s[0xb] = (~uVar6 | uVar24) ^ uVar5;
  s[0x15] = (uVar6 | uVar5) ^ uVar24;
  s[2] = uVar24 & uVar5 ^ uVar6;
  uVar6 = s[0xe];
  uVar24 = s[7];
  uVar5 = uVar6 ^ uVar24 ^ s[0x14];
  uVar17 = (uVar5 << 0x13 | uVar5 >> 0x2d) ^ s[0x14];
  uVar6 = (uVar6 << 0x38 | uVar6 >> 8) ^ uVar17;
  uVar24 = (uVar24 << 0x22 | uVar24 >> 0x1e) ^ uVar24 ^ (uVar17 << 0x27 | uVar17 >> 0x19);
  s[0xe] = (~uVar24 | uVar6) ^ uVar5;
  s[0x14] = (uVar24 | uVar5) ^ uVar6;
  s[7] = uVar6 & uVar5 ^ uVar24;
  uVar6 = s[4];
  uVar24 = s[0xd];
  uVar5 = uVar24 ^ uVar6 ^ s[0x17];
  uVar3 = (uVar5 << 5 | uVar5 >> 0x3b) ^ s[0x17];
  uVar17 = (uVar24 << 8 | uVar24 >> 0x38) ^ uVar3;
  uVar3 = (uVar6 << 0x2e | uVar6 >> 0x12) ^ uVar6 ^ (uVar3 << 0x11 | uVar3 >> 0x2f);
  s[0x17] = (uVar3 | uVar5) ^ uVar17;
  s[4] = uVar17 & uVar5 ^ uVar3;
  uVar6 = s[1];
  uVar24 = s[8];
  uVar21 = uVar24 ^ uVar6 ^ s[0x16];
  uVar22 = (uVar21 << 0x23 | uVar21 >> 0x1d) ^ s[0x16];
  uVar19 = (uVar24 << 0x38 | uVar24 >> 8) ^ uVar22;
  uVar5 = (~uVar3 | uVar17) ^ uVar5;
  uVar24 = (uVar6 << 2 | uVar6 >> 0x3e) ^ uVar6 ^ (uVar22 << 0x37 | uVar22 >> 9);
  s[8] = (~uVar24 | uVar19) ^ uVar21;
  uVar6 = (uVar24 | uVar21) ^ uVar19;
  s[1] = uVar19 & uVar21 ^ uVar24;
  s[10] = s[10] ^ 0x2ab63540d3e64d68;
  uVar24 = uVar6 ^ s[3] ^ uVar5;
  uVar17 = (uVar24 << 0x35 | uVar24 >> 0xb) ^ s[3];
  uVar6 = (uVar6 << 8 | uVar6 >> 0x38) ^ uVar17;
  uVar5 = (uVar5 << 0xe | uVar5 >> 0x32) ^ uVar5 ^ (uVar17 << 1 | (ulong)((long)uVar17 < 0));
  s[0x16] = (~uVar5 | uVar6) ^ uVar24;
  s[3] = (uVar5 | uVar24) ^ uVar6;
  s[0xd] = uVar6 & uVar24 ^ uVar5;
  uVar6 = s[0x13];
  uVar24 = s[0xc];
  uVar5 = uVar6 ^ uVar24 ^ s[6];
  uVar17 = (uVar5 << 0x33 | uVar5 >> 0xd) ^ s[6];
  uVar6 = (uVar6 << 0x38 | uVar6 >> 8) ^ uVar17;
  uVar24 = (uVar24 << 0x22 | uVar24 >> 0x1e) ^ uVar24 ^ (uVar17 << 7 | uVar17 >> 0x39);
  s[0x13] = (~uVar24 | uVar6) ^ uVar5;
  s[6] = (uVar24 | uVar5) ^ uVar6;
  s[0xc] = uVar6 & uVar5 ^ uVar24;
  uVar6 = s[0x10];
  uVar24 = s[0xf];
  uVar5 = uVar6 ^ uVar24 ^ s[5];
  uVar17 = (uVar5 << 0x25 | uVar5 >> 0x1b) ^ s[5];
  uVar6 = (uVar6 << 8 | uVar6 >> 0x38) ^ uVar17;
  uVar24 = (uVar24 << 0x2e | uVar24 >> 0x12) ^ uVar24 ^ (uVar17 << 0x31 | uVar17 >> 0xf);
  s[0x10] = (~uVar24 | uVar6) ^ uVar5;
  s[5] = (uVar24 | uVar5) ^ uVar6;
  s[0xf] = uVar6 & uVar5 ^ uVar24;
  uVar6 = s[0x15];
  uVar24 = s[0xe];
  uVar5 = uVar6 ^ uVar24 ^ *s;
  uVar17 = (uVar5 << 3 | uVar5 >> 0x3d) ^ *s;
  uVar6 = (uVar6 << 0x38 | uVar6 >> 8) ^ uVar17;
  uVar24 = (uVar24 << 2 | uVar24 >> 0x3e) ^ uVar24 ^ (uVar17 << 0x17 | uVar17 >> 0x29);
  s[0x15] = (~uVar24 | uVar6) ^ uVar5;
  *s = (uVar24 | uVar5) ^ uVar6;
  s[0xe] = uVar6 & uVar5 ^ uVar24;
  uVar6 = s[0x12];
  uVar24 = s[9];
  uVar5 = uVar6 ^ uVar24 ^ s[7];
  uVar17 = (uVar5 << 0x15 | uVar5 >> 0x2b) ^ s[7];
  uVar6 = (uVar6 << 8 | uVar6 >> 0x38) ^ uVar17;
  uVar24 = (uVar24 << 0xe | uVar24 >> 0x32) ^ uVar24 ^ (uVar17 << 0x21 | uVar17 >> 0x1f);
  s[0x12] = (~uVar24 | uVar6) ^ uVar5;
  s[7] = (uVar24 | uVar5) ^ uVar6;
  s[9] = uVar6 & uVar5 ^ uVar24;
  uVar6 = s[0x17];
  uVar24 = s[8];
  uVar5 = uVar6 ^ uVar24 ^ s[2];
  uVar17 = (uVar5 << 0x13 | uVar5 >> 0x2d) ^ s[2];
  uVar6 = (uVar6 << 0x38 | uVar6 >> 8) ^ uVar17;
  uVar24 = (uVar24 << 0x22 | uVar24 >> 0x1e) ^ uVar24 ^ (uVar17 << 0x27 | uVar17 >> 0x19);
  s[0x17] = (~uVar24 | uVar6) ^ uVar5;
  s[2] = (uVar24 | uVar5) ^ uVar6;
  s[8] = uVar6 & uVar5 ^ uVar24;
  uVar6 = s[0x14];
  uVar24 = s[0xb];
  uVar5 = uVar6 ^ uVar24 ^ s[1];
  uVar3 = (uVar5 << 5 | uVar5 >> 0x3b) ^ s[1];
  uVar17 = (uVar6 << 8 | uVar6 >> 0x38) ^ uVar3;
  uVar21 = (uVar24 << 0x2e | uVar24 >> 0x12) ^ uVar24 ^ (uVar3 << 0x11 | uVar3 >> 0x2f);
  s[1] = (uVar21 | uVar5) ^ uVar17;
  s[0xb] = uVar17 & uVar5 ^ uVar21;
  uVar6 = s[0x11];
  uVar24 = s[10];
  uVar19 = uVar6 ^ uVar24 ^ s[4];
  uVar22 = (uVar19 << 0x23 | uVar19 >> 0x1d) ^ s[4];
  uVar3 = (uVar6 << 0x38 | uVar6 >> 8) ^ uVar22;
  uVar5 = (~uVar21 | uVar17) ^ uVar5;
  uVar24 = (uVar24 << 2 | uVar24 >> 0x3e) ^ uVar24 ^ (uVar22 << 0x37 | uVar22 >> 9);
  s[0x11] = (~uVar24 | uVar3) ^ uVar19;
  uVar6 = (uVar24 | uVar19) ^ uVar3;
  s[10] = uVar3 & uVar19 ^ uVar24;
  s[0x13] = s[0x13] ^ 0x155b1aa069f326b4;
  uVar24 = uVar6 ^ s[0xc] ^ uVar5;
  uVar17 = (uVar24 << 0x35 | uVar24 >> 0xb) ^ s[0xc];
  uVar6 = (uVar6 << 8 | uVar6 >> 0x38) ^ uVar17;
  uVar5 = (uVar5 << 0xe | uVar5 >> 0x32) ^ uVar5 ^ (uVar17 << 1 | (ulong)((long)uVar17 < 0));
  s[4] = (~uVar5 | uVar6) ^ uVar24;
  s[0xc] = (uVar5 | uVar24) ^ uVar6;
  s[0x14] = uVar6 & uVar24 ^ uVar5;
  uVar6 = s[5];
  uVar24 = s[0x15];
  uVar5 = uVar6 ^ uVar24 ^ s[0xd];
  uVar17 = (uVar5 << 0x33 | uVar5 >> 0xd) ^ s[0xd];
  uVar6 = (uVar6 << 0x38 | uVar6 >> 8) ^ uVar17;
  uVar24 = (uVar24 << 0x22 | uVar24 >> 0x1e) ^ uVar24 ^ (uVar17 << 7 | uVar17 >> 0x39);
  s[5] = (~uVar24 | uVar6) ^ uVar5;
  s[0xd] = (uVar24 | uVar5) ^ uVar6;
  s[0x15] = uVar6 & uVar5 ^ uVar24;
  uVar6 = s[6];
  uVar24 = s[0x16];
  uVar5 = uVar6 ^ uVar24 ^ s[0xe];
  uVar17 = (uVar5 << 0x25 | uVar5 >> 0x1b) ^ s[0xe];
  uVar6 = (uVar6 << 8 | uVar6 >> 0x38) ^ uVar17;
  uVar24 = (uVar24 << 0x2e | uVar24 >> 0x12) ^ uVar24 ^ (uVar17 << 0x31 | uVar17 >> 0xf);
  s[6] = (~uVar24 | uVar6) ^ uVar5;
  s[0xe] = (uVar24 | uVar5) ^ uVar6;
  s[0x16] = uVar6 & uVar5 ^ uVar24;
  uVar6 = s[7];
  uVar24 = s[0x17];
  uVar5 = uVar6 ^ uVar24 ^ s[0xf];
  uVar17 = (uVar5 << 3 | uVar5 >> 0x3d) ^ s[0xf];
  uVar6 = (uVar6 << 0x38 | uVar6 >> 8) ^ uVar17;
  uVar24 = (uVar24 << 2 | uVar24 >> 0x3e) ^ uVar24 ^ (uVar17 << 0x17 | uVar17 >> 0x29);
  s[7] = (~uVar24 | uVar6) ^ uVar5;
  s[0xf] = (uVar24 | uVar5) ^ uVar6;
  s[0x17] = uVar6 & uVar5 ^ uVar24;
  uVar6 = *s;
  uVar24 = s[0x10];
  uVar5 = uVar6 ^ uVar24 ^ s[8];
  uVar17 = (uVar5 << 0x15 | uVar5 >> 0x2b) ^ s[8];
  uVar6 = (uVar6 << 8 | uVar6 >> 0x38) ^ uVar17;
  uVar24 = (uVar24 << 0xe | uVar24 >> 0x32) ^ uVar24 ^ (uVar17 << 0x21 | uVar17 >> 0x1f);
  *s = (~uVar24 | uVar6) ^ uVar5;
  s[8] = (uVar24 | uVar5) ^ uVar6;
  s[0x10] = uVar6 & uVar5 ^ uVar24;
  uVar6 = s[1];
  uVar24 = s[0x11];
  uVar5 = uVar6 ^ uVar24 ^ s[9];
  uVar17 = (uVar5 << 0x13 | uVar5 >> 0x2d) ^ s[9];
  uVar6 = (uVar6 << 0x38 | uVar6 >> 8) ^ uVar17;
  uVar24 = (uVar24 << 0x22 | uVar24 >> 0x1e) ^ uVar24 ^ (uVar17 << 0x27 | uVar17 >> 0x19);
  s[1] = (~uVar24 | uVar6) ^ uVar5;
  s[9] = (uVar24 | uVar5) ^ uVar6;
  s[0x11] = uVar6 & uVar5 ^ uVar24;
  uVar6 = s[2];
  uVar24 = s[0x12];
  uVar5 = uVar6 ^ uVar24 ^ s[10];
  uVar3 = (uVar5 << 5 | uVar5 >> 0x3b) ^ s[10];
  uVar17 = (uVar6 << 8 | uVar6 >> 0x38) ^ uVar3;
  uVar21 = (uVar24 << 0x2e | uVar24 >> 0x12) ^ uVar24 ^ (uVar3 << 0x11 | uVar3 >> 0x2f);
  s[10] = (uVar21 | uVar5) ^ uVar17;
  s[0x12] = uVar17 & uVar5 ^ uVar21;
  uVar6 = s[3];
  uVar24 = s[0x13];
  uVar3 = uVar6 ^ uVar24 ^ s[0xb];
  uVar22 = (uVar3 << 0x23 | uVar3 >> 0x1d) ^ s[0xb];
  uVar19 = (uVar6 << 0x38 | uVar6 >> 8) ^ uVar22;
  uVar5 = (~uVar21 | uVar17) ^ uVar5;
  uVar24 = (uVar24 << 2 | uVar24 >> 0x3e) ^ uVar24 ^ (uVar22 << 0x37 | uVar22 >> 9);
  s[3] = (~uVar24 | uVar19) ^ uVar3;
  uVar6 = (uVar24 | uVar3) ^ uVar19;
  s[0x13] = uVar19 & uVar3 ^ uVar24;
  s[5] = s[5] ^ 0xaad8d5034f9935a;
  uVar24 = uVar6 ^ s[0x15] ^ uVar5;
  uVar17 = (uVar24 << 0x35 | uVar24 >> 0xb) ^ s[0x15];
  uVar6 = (uVar6 << 8 | uVar6 >> 0x38) ^ uVar17;
  uVar5 = (uVar5 << 0xe | uVar5 >> 0x32) ^ uVar5 ^ (uVar17 << 1 | (ulong)((long)uVar17 < 0));
  s[0xb] = (~uVar5 | uVar6) ^ uVar24;
  s[0x15] = (uVar5 | uVar24) ^ uVar6;
  s[2] = uVar6 & uVar24 ^ uVar5;
  uVar6 = s[0xe];
  uVar24 = s[7];
  uVar5 = uVar6 ^ uVar24 ^ s[0x14];
  uVar17 = (uVar5 << 0x33 | uVar5 >> 0xd) ^ s[0x14];
  uVar6 = (uVar6 << 0x38 | uVar6 >> 8) ^ uVar17;
  uVar24 = (uVar24 << 0x22 | uVar24 >> 0x1e) ^ uVar24 ^ (uVar17 << 7 | uVar17 >> 0x39);
  s[0xe] = (~uVar24 | uVar6) ^ uVar5;
  s[0x14] = (uVar24 | uVar5) ^ uVar6;
  s[7] = uVar6 & uVar5 ^ uVar24;
  uVar6 = s[4];
  uVar24 = s[0xd];
  uVar5 = uVar24 ^ uVar6 ^ s[0x17];
  uVar17 = (uVar5 << 0x25 | uVar5 >> 0x1b) ^ s[0x17];
  uVar24 = (uVar24 << 8 | uVar24 >> 0x38) ^ uVar17;
  uVar6 = (uVar6 << 0x2e | uVar6 >> 0x12) ^ uVar6 ^ (uVar17 << 0x31 | uVar17 >> 0xf);
  s[0xd] = (~uVar6 | uVar24) ^ uVar5;
  s[0x17] = (uVar6 | uVar5) ^ uVar24;
  s[4] = uVar24 & uVar5 ^ uVar6;
  uVar6 = s[8];
  uVar24 = s[1];
  uVar5 = uVar6 ^ uVar24 ^ s[0x16];
  uVar17 = (uVar5 << 3 | uVar5 >> 0x3d) ^ s[0x16];
  uVar6 = (uVar6 << 0x38 | uVar6 >> 8) ^ uVar17;
  uVar24 = (uVar24 << 2 | uVar24 >> 0x3e) ^ uVar24 ^ (uVar17 << 0x17 | uVar17 >> 0x29);
  s[8] = (~uVar24 | uVar6) ^ uVar5;
  s[0x16] = (uVar24 | uVar5) ^ uVar6;
  s[1] = uVar6 & uVar5 ^ uVar24;
  uVar6 = s[6];
  uVar24 = s[0xf];
  uVar5 = uVar24 ^ uVar6 ^ s[0x11];
  uVar17 = (uVar5 << 0x15 | uVar5 >> 0x2b) ^ s[0x11];
  uVar24 = (uVar24 << 8 | uVar24 >> 0x38) ^ uVar17;
  uVar6 = (uVar6 << 0xe | uVar6 >> 0x32) ^ uVar6 ^ (uVar17 << 0x21 | uVar17 >> 0x1f);
  s[0xf] = (~uVar6 | uVar24) ^ uVar5;
  s[0x11] = (uVar6 | uVar5) ^ uVar24;
  s[6] = uVar24 & uVar5 ^ uVar6;
  uVar6 = s[10];
  uVar24 = s[3];
  uVar5 = uVar6 ^ uVar24 ^ s[0x10];
  uVar17 = (uVar5 << 0x13 | uVar5 >> 0x2d) ^ s[0x10];
  uVar6 = (uVar6 << 0x38 | uVar6 >> 8) ^ uVar17;
  uVar24 = (uVar24 << 0x22 | uVar24 >> 0x1e) ^ uVar24 ^ (uVar17 << 0x27 | uVar17 >> 0x19);
  s[10] = (~uVar24 | uVar6) ^ uVar5;
  s[0x10] = (uVar24 | uVar5) ^ uVar6;
  s[3] = uVar6 & uVar5 ^ uVar24;
  uVar6 = *s;
  uVar24 = s[9];
  uVar5 = uVar24 ^ uVar6 ^ s[0x13];
  uVar3 = (uVar5 << 5 | uVar5 >> 0x3b) ^ s[0x13];
  uVar17 = (uVar24 << 8 | uVar24 >> 0x38) ^ uVar3;
  uVar3 = (uVar6 << 0x2e | uVar6 >> 0x12) ^ uVar6 ^ (uVar3 << 0x11 | uVar3 >> 0x2f);
  s[0x13] = (uVar3 | uVar5) ^ uVar17;
  *s = uVar17 & uVar5 ^ uVar3;
  uVar6 = s[5];
  uVar24 = s[0xc];
  uVar21 = uVar24 ^ uVar6 ^ s[0x12];
  uVar22 = (uVar21 << 0x23 | uVar21 >> 0x1d) ^ s[0x12];
  uVar19 = (uVar24 << 0x38 | uVar24 >> 8) ^ uVar22;
  uVar5 = (~uVar3 | uVar17) ^ uVar5;
  uVar24 = (uVar6 << 2 | uVar6 >> 0x3e) ^ uVar6 ^ (uVar22 << 0x37 | uVar22 >> 9);
  s[0xc] = (~uVar24 | uVar19) ^ uVar21;
  uVar6 = (uVar24 | uVar21) ^ uVar19;
  s[5] = uVar19 & uVar21 ^ uVar24;
  s[0xe] = s[0xe] ^ 0x556c6a81a7cc9ad;
  uVar24 = uVar6 ^ s[7] ^ uVar5;
  uVar17 = (uVar24 << 0x35 | uVar24 >> 0xb) ^ s[7];
  uVar6 = (uVar6 << 8 | uVar6 >> 0x38) ^ uVar17;
  uVar5 = (uVar5 << 0xe | uVar5 >> 0x32) ^ uVar5 ^ (uVar17 << 1 | (ulong)((long)uVar17 < 0));
  s[0x12] = (~uVar5 | uVar6) ^ uVar24;
  s[7] = (uVar5 | uVar24) ^ uVar6;
  s[9] = uVar6 & uVar24 ^ uVar5;
  uVar6 = s[0x17];
  uVar24 = s[8];
  uVar5 = uVar6 ^ uVar24 ^ s[2];
  uVar17 = (uVar5 << 0x33 | uVar5 >> 0xd) ^ s[2];
  uVar6 = (uVar6 << 0x38 | uVar6 >> 8) ^ uVar17;
  uVar24 = (uVar24 << 0x22 | uVar24 >> 0x1e) ^ uVar24 ^ (uVar17 << 7 | uVar17 >> 0x39);
  s[0x17] = (~uVar24 | uVar6) ^ uVar5;
  s[2] = (uVar24 | uVar5) ^ uVar6;
  s[8] = uVar6 & uVar5 ^ uVar24;
  uVar6 = s[0x14];
  uVar24 = s[0xb];
  uVar5 = uVar6 ^ uVar24 ^ s[1];
  uVar17 = (uVar5 << 0x25 | uVar5 >> 0x1b) ^ s[1];
  uVar6 = (uVar6 << 8 | uVar6 >> 0x38) ^ uVar17;
  uVar24 = (uVar24 << 0x2e | uVar24 >> 0x12) ^ uVar24 ^ (uVar17 << 0x31 | uVar17 >> 0xf);
  s[0x14] = (~uVar24 | uVar6) ^ uVar5;
  s[1] = (uVar24 | uVar5) ^ uVar6;
  s[0xb] = uVar6 & uVar5 ^ uVar24;
  uVar6 = s[0x11];
  uVar24 = s[10];
  uVar5 = uVar6 ^ uVar24 ^ s[4];
  uVar17 = (uVar5 << 3 | uVar5 >> 0x3d) ^ s[4];
  uVar6 = (uVar6 << 0x38 | uVar6 >> 8) ^ uVar17;
  uVar24 = (uVar24 << 2 | uVar24 >> 0x3e) ^ uVar24 ^ (uVar17 << 0x17 | uVar17 >> 0x29);
  s[0x11] = (~uVar24 | uVar6) ^ uVar5;
  s[4] = (uVar24 | uVar5) ^ uVar6;
  s[10] = uVar6 & uVar5 ^ uVar24;
  uVar6 = s[0x16];
  uVar24 = s[0xd];
  uVar5 = uVar6 ^ uVar24 ^ s[3];
  uVar17 = (uVar5 << 0x15 | uVar5 >> 0x2b) ^ s[3];
  uVar6 = (uVar6 << 8 | uVar6 >> 0x38) ^ uVar17;
  uVar24 = (uVar24 << 0xe | uVar24 >> 0x32) ^ uVar24 ^ (uVar17 << 0x21 | uVar17 >> 0x1f);
  s[0x16] = (~uVar24 | uVar6) ^ uVar5;
  s[3] = (uVar24 | uVar5) ^ uVar6;
  s[0xd] = uVar6 & uVar5 ^ uVar24;
  uVar6 = s[0x13];
  uVar24 = s[0xc];
  uVar5 = uVar6 ^ uVar24 ^ s[6];
  uVar17 = (uVar5 << 0x13 | uVar5 >> 0x2d) ^ s[6];
  uVar6 = (uVar6 << 0x38 | uVar6 >> 8) ^ uVar17;
  uVar24 = (uVar24 << 0x22 | uVar24 >> 0x1e) ^ uVar24 ^ (uVar17 << 0x27 | uVar17 >> 0x19);
  s[0x13] = (~uVar24 | uVar6) ^ uVar5;
  s[6] = (uVar24 | uVar5) ^ uVar6;
  s[0xc] = uVar6 & uVar5 ^ uVar24;
  uVar6 = s[0x10];
  uVar24 = s[0xf];
  uVar5 = uVar6 ^ uVar24 ^ s[5];
  uVar17 = (uVar5 << 5 | uVar5 >> 0x3b) ^ s[5];
  uVar6 = (uVar6 << 8 | uVar6 >> 0x38) ^ uVar17;
  uVar24 = (uVar24 << 0x2e | uVar24 >> 0x12) ^ uVar24 ^ (uVar17 << 0x11 | uVar17 >> 0x2f);
  s[0x10] = (~uVar24 | uVar6) ^ uVar5;
  s[5] = (uVar24 | uVar5) ^ uVar6;
  s[0xf] = uVar6 & uVar5 ^ uVar24;
  uVar6 = s[0x15];
  uVar24 = s[0xe];
  uVar5 = uVar6 ^ uVar24 ^ *s;
  uVar17 = (uVar5 << 0x23 | uVar5 >> 0x1d) ^ *s;
  uVar6 = (uVar6 << 0x38 | uVar6 >> 8) ^ uVar17;
  uVar24 = (uVar24 << 2 | uVar24 >> 0x3e) ^ uVar24 ^ (uVar17 << 0x37 | uVar17 >> 9);
  s[0x15] = (~uVar24 | uVar6) ^ uVar5;
  *s = (uVar24 | uVar5) ^ uVar6;
  s[0xe] = uVar6 & uVar5 ^ uVar24;
  s[0x17] = s[0x17] ^ 0xde8082cd72debc78;
  return;
}

Assistant:

static void bashF0(u64 s[24])
{
	register u64 t0;
	register u64 t1;
	register u64 t2;
	bashR(s, P0, P1,  1, t0, t1, t2);
	bashR(s, P1, P2,  2, t0, t1, t2);
	bashR(s, P2, P3,  3, t0, t1, t2);
	bashR(s, P3, P4,  4, t0, t1, t2);
	bashR(s, P4, P5,  5, t0, t1, t2);
	bashR(s, P5, P0,  6, t0, t1, t2);
	bashR(s, P0, P1,  7, t0, t1, t2);
	bashR(s, P1, P2,  8, t0, t1, t2);
	bashR(s, P2, P3,  9, t0, t1, t2);
	bashR(s, P3, P4, 10, t0, t1, t2);
	bashR(s, P4, P5, 11, t0, t1, t2);
	bashR(s, P5, P0, 12, t0, t1, t2);
	bashR(s, P0, P1, 13, t0, t1, t2);
	bashR(s, P1, P2, 14, t0, t1, t2);
	bashR(s, P2, P3, 15, t0, t1, t2);
	bashR(s, P3, P4, 16, t0, t1, t2);
	bashR(s, P4, P5, 17, t0, t1, t2);
	bashR(s, P5, P0, 18, t0, t1, t2);
	bashR(s, P0, P1, 19, t0, t1, t2);
	bashR(s, P1, P2, 20, t0, t1, t2);
	bashR(s, P2, P3, 21, t0, t1, t2);
	bashR(s, P3, P4, 22, t0, t1, t2);
	bashR(s, P4, P5, 23, t0, t1, t2);
	bashR(s, P5, P0, 24, t0, t1, t2);
	t0 = t1 = t2 = 0;
}